

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactionProduct.test.cpp
# Opt level: O1

void verifyChunkWithLAW1(ReactionProduct *chunk)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double *pdVar10;
  bool bVar11;
  long lVar12;
  variant_alternative_t<2UL,_variant<DefinedElsewhere,_Unknown,_ContinuumEnergyAngle,_DiscreteTwoBodyScattering,_IsotropicDiscreteEmission,_DiscreteTwoBodyRecoils,_ChargedParticleElasticScattering,_NBodyPhaseSpace,_LaboratoryAngleEnergy>_>
  *pvVar13;
  variant_alternative_t<0UL,_variant<LegendreCoefficients,_KalbachMann,_ThermalScatteringData,_TabulatedDistribution>_>
  *pvVar14;
  ulong uVar15;
  double *pdVar16;
  unsigned_long n;
  char *pcVar17;
  difference_type d;
  char *pcVar18;
  double dVar19;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  StringRef macroName_11;
  StringRef macroName_12;
  StringRef macroName_13;
  StringRef macroName_14;
  StringRef macroName_15;
  StringRef macroName_16;
  StringRef macroName_17;
  StringRef macroName_18;
  StringRef macroName_19;
  StringRef macroName_20;
  StringRef macroName_21;
  StringRef macroName_22;
  StringRef macroName_23;
  StringRef macroName_24;
  StringRef macroName_25;
  StringRef macroName_26;
  StringRef macroName_27;
  StringRef macroName_28;
  StringRef macroName_29;
  StringRef macroName_30;
  StringRef macroName_31;
  StringRef macroName_32;
  StringRef macroName_33;
  StringRef macroName_34;
  StringRef macroName_35;
  StringRef macroName_36;
  StringRef macroName_37;
  StringRef macroName_38;
  StringRef macroName_39;
  StringRef macroName_40;
  StringRef macroName_41;
  StringRef macroName_42;
  StringRef macroName_43;
  StringRef macroName_44;
  StringRef macroName_45;
  StringRef macroName_46;
  StringRef macroName_47;
  StringRef macroName_48;
  StringRef macroName_49;
  StringRef macroName_50;
  StringRef macroName_51;
  StringRef macroName_52;
  StringRef macroName_53;
  StringRef macroName_54;
  StringRef macroName_55;
  StringRef macroName_56;
  StringRef macroName_57;
  StringRef macroName_58;
  StringRef macroName_59;
  StringRef macroName_60;
  StringRef macroName_61;
  StringRef macroName_62;
  StringRef macroName_63;
  StringRef macroName_64;
  StringRef macroName_65;
  StringRef macroName_66;
  StringRef macroName_67;
  StringRef macroName_68;
  StringRef macroName_69;
  StringRef macroName_70;
  StringRef macroName_71;
  StringRef macroName_72;
  StringRef macroName_73;
  StringRef macroName_74;
  StringRef macroName_75;
  StringRef macroName_76;
  StringRef macroName_77;
  StringRef macroName_78;
  StringRef macroName_79;
  StringRef macroName_80;
  StringRef macroName_81;
  StringRef macroName_82;
  StringRef macroName_83;
  StringRef macroName_84;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  StringRef capturedExpression_14;
  StringRef capturedExpression_15;
  StringRef capturedExpression_16;
  StringRef capturedExpression_17;
  StringRef capturedExpression_18;
  StringRef capturedExpression_19;
  StringRef capturedExpression_20;
  StringRef capturedExpression_21;
  StringRef capturedExpression_22;
  StringRef capturedExpression_23;
  StringRef capturedExpression_24;
  StringRef capturedExpression_25;
  StringRef capturedExpression_26;
  StringRef capturedExpression_27;
  StringRef capturedExpression_28;
  StringRef capturedExpression_29;
  StringRef capturedExpression_30;
  StringRef capturedExpression_31;
  StringRef capturedExpression_32;
  StringRef capturedExpression_33;
  StringRef capturedExpression_34;
  StringRef capturedExpression_35;
  StringRef capturedExpression_36;
  StringRef capturedExpression_37;
  StringRef capturedExpression_38;
  StringRef capturedExpression_39;
  StringRef capturedExpression_40;
  StringRef capturedExpression_41;
  StringRef capturedExpression_42;
  StringRef capturedExpression_43;
  StringRef capturedExpression_44;
  StringRef capturedExpression_45;
  StringRef capturedExpression_46;
  StringRef capturedExpression_47;
  StringRef capturedExpression_48;
  StringRef capturedExpression_49;
  StringRef capturedExpression_50;
  StringRef capturedExpression_51;
  StringRef capturedExpression_52;
  StringRef capturedExpression_53;
  StringRef capturedExpression_54;
  StringRef capturedExpression_55;
  StringRef capturedExpression_56;
  StringRef capturedExpression_57;
  StringRef capturedExpression_58;
  StringRef capturedExpression_59;
  StringRef capturedExpression_60;
  StringRef capturedExpression_61;
  StringRef capturedExpression_62;
  StringRef capturedExpression_63;
  StringRef capturedExpression_64;
  StringRef capturedExpression_65;
  StringRef capturedExpression_66;
  StringRef capturedExpression_67;
  StringRef capturedExpression_68;
  StringRef capturedExpression_69;
  StringRef capturedExpression_70;
  StringRef capturedExpression_71;
  StringRef capturedExpression_72;
  StringRef capturedExpression_73;
  StringRef capturedExpression_74;
  StringRef capturedExpression_75;
  StringRef capturedExpression_76;
  StringRef capturedExpression_77;
  StringRef capturedExpression_78;
  StringRef capturedExpression_79;
  StringRef capturedExpression_80;
  StringRef capturedExpression_81;
  StringRef capturedExpression_82;
  StringRef capturedExpression_83;
  StringRef capturedExpression_84;
  LegendreCoefficients subsection2;
  LegendreCoefficients subsection1;
  AssertionHandler catchAssertionHandler_68;
  ContinuumEnergyAngle law;
  undefined1 local_298 [8];
  undefined8 uStack_290;
  double *local_288;
  WithinRelMatcher *pWStack_280;
  char *local_278;
  double dStack_270;
  undefined1 local_268 [16];
  IResultCapture *local_258;
  undefined1 local_248 [8];
  undefined8 uStack_240;
  char *local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_230;
  double dStack_220;
  undefined1 local_218 [16];
  IResultCapture *local_208;
  undefined1 local_200 [8];
  undefined8 local_1f8;
  char *local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8 [2];
  bool local_1c5;
  IResultCapture *local_1c0;
  undefined1 local_1b8 [8];
  undefined8 local_1b0;
  double *local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [2];
  undefined1 local_180 [9];
  bool bStack_177;
  undefined6 uStack_176;
  iterator_t<CRng> *local_170;
  WithinRelMatcher *local_168;
  long local_160;
  undefined1 local_158 [48];
  undefined1 local_128 [16];
  IResultCapture *local_118;
  vector<long,_std::allocator<long>_> local_110;
  vector<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>_>
  local_f8;
  undefined1 local_d8 [9];
  bool bStack_cf;
  undefined6 uStack_ce;
  double *local_c8;
  WithinRelMatcher *local_c0;
  iterator_t<CRng> local_b8;
  undefined1 *local_b0;
  double local_a8;
  iterator_t<CRng> local_a0;
  undefined1 *local_98;
  iterator_t<CRng> local_90;
  undefined1 *local_88;
  iterator_t<CRng> local_80;
  undefined1 *local_78;
  iterator_t<CRng> local_70;
  undefined1 *local_68;
  iterator_t<CRng> local_60;
  undefined1 *local_58;
  iterator_t<CRng> local_50;
  undefined1 *local_48;
  iterator_t<CRng> local_40;
  undefined1 *local_38;
  
  local_248 = (undefined1  [8])0x1db560;
  uStack_240 = (pointer)0x37f;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0x13;
  capturedExpression.m_start = "1001 == chunk.ZAP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_158,macroName,(SourceLineInfo *)local_248,capturedExpression,
             ContinueOnFailure);
  dVar19 = round((chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.metadata.
                 fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                 super__Head_base<0UL,_double,_false>._M_head_impl);
  uStack_240._1_1_ = (int)dVar19 == 0x3e9;
  uStack_240._0_1_ = true;
  local_248 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d1b0;
  uStack_240._4_4_ = 0x3e9;
  local_238 = "==";
  aStack_230._M_allocated_capacity = 2;
  aStack_230._8_4_ = (int)dVar19;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_158,(ITransientExpression *)local_248);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_248);
  Catch::AssertionHandler::complete((AssertionHandler *)local_158);
  if (local_128[0xb] == false) {
    (*local_118->_vptr_IResultCapture[0x13])();
  }
  local_248 = (undefined1  [8])0x1db560;
  uStack_240 = (pointer)0x380;
  macroName_00.m_size = 10;
  macroName_00.m_start = "CHECK_THAT";
  capturedExpression_00.m_size = 0x23;
  capturedExpression_00.m_start = "0.9986234, WithinRel( chunk.AWP() )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_158,macroName_00,(SourceLineInfo *)local_248,
             capturedExpression_00,ContinueOnFailure);
  local_200 = (undefined1  [8])0x3feff4b90f80a684;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_248,
             (chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Head_base<1UL,_double,_false>._M_head_impl);
  bVar11 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_248,(double *)local_200);
  uStack_290._0_2_ = CONCAT11(bVar11,true);
  local_298 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d1f0;
  local_288 = (double *)local_200;
  pWStack_280 = (WithinRelMatcher *)local_248;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_158,(ITransientExpression *)local_298);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_298);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_248);
  Catch::AssertionHandler::complete((AssertionHandler *)local_158);
  if (local_128[0xb] == false) {
    (*local_118->_vptr_IResultCapture[0x13])();
  }
  local_248 = (undefined1  [8])0x1db560;
  uStack_240 = (pointer)0x381;
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  capturedExpression_01.m_size = 0x10;
  capturedExpression_01.m_start = "0 == chunk.LIP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_158,macroName_01,(SourceLineInfo *)local_248,
             capturedExpression_01,ContinueOnFailure);
  iVar1 = (int)(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.metadata.fields
               .super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
               _M_head_impl;
  uStack_240._1_1_ = iVar1 == 0;
  uStack_240._0_1_ = true;
  local_248 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d1b0;
  uStack_240 = uStack_240 & 0xffffffff;
  local_238 = "==";
  aStack_230._M_allocated_capacity = 2;
  aStack_230._8_4_ = iVar1;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_158,(ITransientExpression *)local_248);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_248);
  Catch::AssertionHandler::complete((AssertionHandler *)local_158);
  if (local_128[0xb] == false) {
    (*local_118->_vptr_IResultCapture[0x13])();
  }
  local_248 = (undefined1  [8])0x1db560;
  uStack_240 = (pointer)0x382;
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  capturedExpression_02.m_size = 0x10;
  capturedExpression_02.m_start = "1 == chunk.LAW()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_158,macroName_02,(SourceLineInfo *)local_248,
             capturedExpression_02,ContinueOnFailure);
  iVar1 = (int)(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.metadata.fields
               .super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
               _M_head_impl;
  uStack_240._1_1_ = iVar1 == 1;
  uStack_240._0_1_ = true;
  local_248 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d1b0;
  uStack_240._4_4_ = 1;
  local_238 = "==";
  aStack_230._M_allocated_capacity = 2;
  aStack_230._8_4_ = iVar1;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_158,(ITransientExpression *)local_248);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_248);
  Catch::AssertionHandler::complete((AssertionHandler *)local_158);
  if (local_128[0xb] == false) {
    (*local_118->_vptr_IResultCapture[0x13])();
  }
  local_248 = (undefined1  [8])0x1db560;
  uStack_240 = (pointer)0x384;
  macroName_03.m_size = 5;
  macroName_03.m_start = "CHECK";
  capturedExpression_03.m_size = 0x22;
  capturedExpression_03.m_start = "1001 == chunk.multiplicity().ZAP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_158,macroName_03,(SourceLineInfo *)local_248,
             capturedExpression_03,ContinueOnFailure);
  dVar19 = round((chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.metadata.
                 fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                 super__Head_base<0UL,_double,_false>._M_head_impl);
  uStack_240._1_1_ = (int)dVar19 == 0x3e9;
  uStack_240._0_1_ = true;
  local_248 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d1b0;
  uStack_240._4_4_ = 0x3e9;
  local_238 = "==";
  aStack_230._M_allocated_capacity = 2;
  aStack_230._8_4_ = (int)dVar19;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_158,(ITransientExpression *)local_248);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_248);
  Catch::AssertionHandler::complete((AssertionHandler *)local_158);
  if (local_128[0xb] == false) {
    (*local_118->_vptr_IResultCapture[0x13])();
  }
  local_248 = (undefined1  [8])0x1db560;
  uStack_240 = (pointer)0x385;
  macroName_04.m_size = 10;
  macroName_04.m_start = "CHECK_THAT";
  capturedExpression_04.m_size = 0x32;
  capturedExpression_04.m_start = "0.9986234, WithinRel( chunk.multiplicity().AWP() )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_158,macroName_04,(SourceLineInfo *)local_248,
             capturedExpression_04,ContinueOnFailure);
  local_200 = (undefined1  [8])0x3feff4b90f80a684;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_248,
             (chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Head_base<1UL,_double,_false>._M_head_impl);
  bVar11 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_248,(double *)local_200);
  uStack_290._0_2_ = CONCAT11(bVar11,true);
  local_298 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d1f0;
  local_288 = (double *)local_200;
  pWStack_280 = (WithinRelMatcher *)local_248;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_158,(ITransientExpression *)local_298);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_298);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_248);
  Catch::AssertionHandler::complete((AssertionHandler *)local_158);
  if (local_128[0xb] == false) {
    (*local_118->_vptr_IResultCapture[0x13])();
  }
  local_248 = (undefined1  [8])0x1db560;
  uStack_240 = (pointer)0x386;
  macroName_05.m_size = 5;
  macroName_05.m_start = "CHECK";
  capturedExpression_05.m_size = 0x1f;
  capturedExpression_05.m_start = "0 == chunk.multiplicity().LIP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_158,macroName_05,(SourceLineInfo *)local_248,
             capturedExpression_05,ContinueOnFailure);
  iVar1 = (int)(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.metadata.fields
               .super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
               _M_head_impl;
  uStack_240._1_1_ = iVar1 == 0;
  uStack_240._0_1_ = true;
  local_248 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d1b0;
  uStack_240 = uStack_240 & 0xffffffff;
  local_238 = "==";
  aStack_230._M_allocated_capacity = 2;
  aStack_230._8_4_ = iVar1;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_158,(ITransientExpression *)local_248);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_248);
  Catch::AssertionHandler::complete((AssertionHandler *)local_158);
  if (local_128[0xb] == false) {
    (*local_118->_vptr_IResultCapture[0x13])();
  }
  local_248 = (undefined1  [8])0x1db560;
  uStack_240 = (pointer)0x387;
  macroName_06.m_size = 5;
  macroName_06.m_start = "CHECK";
  capturedExpression_06.m_size = 0x1f;
  capturedExpression_06.m_start = "1 == chunk.multiplicity().LAW()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_158,macroName_06,(SourceLineInfo *)local_248,
             capturedExpression_06,ContinueOnFailure);
  iVar1 = (int)(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.metadata.fields
               .super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
               _M_head_impl;
  uStack_240._1_1_ = iVar1 == 1;
  uStack_240._0_1_ = true;
  local_248 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d1b0;
  uStack_240._4_4_ = 1;
  local_238 = "==";
  aStack_230._M_allocated_capacity = 2;
  aStack_230._8_4_ = iVar1;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_158,(ITransientExpression *)local_248);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_248);
  Catch::AssertionHandler::complete((AssertionHandler *)local_158);
  if (local_128[0xb] == false) {
    (*local_118->_vptr_IResultCapture[0x13])();
  }
  local_248 = (undefined1  [8])0x1db560;
  uStack_240 = (pointer)0x389;
  macroName_07.m_size = 5;
  macroName_07.m_start = "CHECK";
  capturedExpression_07.m_size = 0x1e;
  capturedExpression_07.m_start = "4 == chunk.multiplicity().NP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_158,macroName_07,(SourceLineInfo *)local_248,
             capturedExpression_07,ContinueOnFailure);
  lVar12 = (long)(chunk->multiplicity_).super_TabulationRecord.xValues.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_finish -
           (long)(chunk->multiplicity_).super_TabulationRecord.xValues.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
  aStack_230._8_8_ = lVar12 >> 3;
  uStack_240._1_1_ = lVar12 == 0x20;
  uStack_240._0_1_ = true;
  local_248 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d230;
  uStack_240._4_4_ = 4;
  local_238 = "==";
  aStack_230._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_158,(ITransientExpression *)local_248);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_248);
  Catch::AssertionHandler::complete((AssertionHandler *)local_158);
  if (local_128[0xb] == false) {
    (*local_118->_vptr_IResultCapture[0x13])();
  }
  local_248 = (undefined1  [8])0x1db560;
  uStack_240 = (pointer)0x38a;
  macroName_08.m_size = 5;
  macroName_08.m_start = "CHECK";
  capturedExpression_08.m_size = 0x28;
  capturedExpression_08.m_start = "4 == chunk.multiplicity().numberPoints()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_158,macroName_08,(SourceLineInfo *)local_248,
             capturedExpression_08,ContinueOnFailure);
  lVar12 = (long)(chunk->multiplicity_).super_TabulationRecord.xValues.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_finish -
           (long)(chunk->multiplicity_).super_TabulationRecord.xValues.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
  aStack_230._8_8_ = lVar12 >> 3;
  uStack_240._1_1_ = lVar12 == 0x20;
  uStack_240._0_1_ = true;
  local_248 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d230;
  uStack_240._4_4_ = 4;
  local_238 = "==";
  aStack_230._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_158,(ITransientExpression *)local_248);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_248);
  Catch::AssertionHandler::complete((AssertionHandler *)local_158);
  if (local_128[0xb] == false) {
    (*local_118->_vptr_IResultCapture[0x13])();
  }
  local_248 = (undefined1  [8])0x1db560;
  uStack_240 = (pointer)0x38b;
  macroName_09.m_size = 5;
  macroName_09.m_start = "CHECK";
  capturedExpression_09.m_size = 0x1e;
  capturedExpression_09.m_start = "1 == chunk.multiplicity().NR()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_158,macroName_09,(SourceLineInfo *)local_248,
             capturedExpression_09,ContinueOnFailure);
  lVar12 = (long)(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.
                 boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.
                 boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
  aStack_230._8_8_ = lVar12 >> 3;
  uStack_240._1_1_ = lVar12 == 8;
  uStack_240._0_1_ = true;
  local_248 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d230;
  uStack_240._4_4_ = 1;
  local_238 = "==";
  aStack_230._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_158,(ITransientExpression *)local_248);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_248);
  Catch::AssertionHandler::complete((AssertionHandler *)local_158);
  if (local_128[0xb] == false) {
    (*local_118->_vptr_IResultCapture[0x13])();
  }
  local_248 = (undefined1  [8])0x1db560;
  uStack_240 = (pointer)0x38c;
  macroName_10.m_size = 5;
  macroName_10.m_start = "CHECK";
  capturedExpression_10.m_size = 0x36;
  capturedExpression_10.m_start = "1 == chunk.multiplicity().numberInterpolationRegions()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_158,macroName_10,(SourceLineInfo *)local_248,
             capturedExpression_10,ContinueOnFailure);
  lVar12 = (long)(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.
                 boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.
                 boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
  aStack_230._8_8_ = lVar12 >> 3;
  uStack_240._1_1_ = lVar12 == 8;
  uStack_240._0_1_ = true;
  local_248 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d230;
  uStack_240._4_4_ = 1;
  local_238 = "==";
  aStack_230._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_158,(ITransientExpression *)local_248);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_248);
  Catch::AssertionHandler::complete((AssertionHandler *)local_158);
  if (local_128[0xb] == false) {
    (*local_118->_vptr_IResultCapture[0x13])();
  }
  local_248 = (undefined1  [8])0x1db560;
  uStack_240 = (pointer)0x38d;
  macroName_11.m_size = 5;
  macroName_11.m_start = "CHECK";
  capturedExpression_11.m_size = 0x26;
  capturedExpression_11.m_start = "1 == chunk.multiplicity().INT().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_158,macroName_11,(SourceLineInfo *)local_248,
             capturedExpression_11,ContinueOnFailure);
  lVar12 = (long)(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.
                 interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.
                 interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
  aStack_230._8_8_ = lVar12 >> 3;
  uStack_240._1_1_ = lVar12 == 8;
  uStack_240._0_1_ = true;
  local_248 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d270;
  uStack_240._4_4_ = 1;
  local_238 = "==";
  aStack_230._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_158,(ITransientExpression *)local_248);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_248);
  Catch::AssertionHandler::complete((AssertionHandler *)local_158);
  if (local_128[0xb] == false) {
    (*local_118->_vptr_IResultCapture[0x13])();
  }
  local_248 = (undefined1  [8])0x1db560;
  uStack_240 = (pointer)0x38e;
  macroName_12.m_size = 5;
  macroName_12.m_start = "CHECK";
  capturedExpression_12.m_size = 0x26;
  capturedExpression_12.m_start = "1 == chunk.multiplicity().NBT().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_158,macroName_12,(SourceLineInfo *)local_248,
             capturedExpression_12,ContinueOnFailure);
  lVar12 = (long)(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.
                 boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.
                 boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
  aStack_230._8_8_ = lVar12 >> 3;
  uStack_240._1_1_ = lVar12 == 8;
  uStack_240._0_1_ = true;
  local_248 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d270;
  uStack_240._4_4_ = 1;
  local_238 = "==";
  aStack_230._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_158,(ITransientExpression *)local_248);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_248);
  Catch::AssertionHandler::complete((AssertionHandler *)local_158);
  if (local_128[0xb] == false) {
    (*local_118->_vptr_IResultCapture[0x13])();
  }
  local_248 = (undefined1  [8])0x1db560;
  uStack_240 = (pointer)0x38f;
  macroName_13.m_size = 5;
  macroName_13.m_start = "CHECK";
  capturedExpression_13.m_size = 0x22;
  capturedExpression_13.m_start = "2 == chunk.multiplicity().INT()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_158,macroName_13,(SourceLineInfo *)local_248,
             capturedExpression_13,ContinueOnFailure);
  aStack_230._8_8_ =
       *(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.
        interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_start;
  uStack_240._1_1_ = aStack_230._8_8_ == 2;
  uStack_240._0_1_ = true;
  local_248 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d230;
  uStack_240._4_4_ = 2;
  local_238 = "==";
  aStack_230._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_158,(ITransientExpression *)local_248);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_248);
  Catch::AssertionHandler::complete((AssertionHandler *)local_158);
  if (local_128[0xb] == false) {
    (*local_118->_vptr_IResultCapture[0x13])();
  }
  local_248 = (undefined1  [8])0x1db560;
  uStack_240 = (pointer)0x390;
  macroName_14.m_size = 5;
  macroName_14.m_start = "CHECK";
  capturedExpression_14.m_size = 0x22;
  capturedExpression_14.m_start = "4 == chunk.multiplicity().NBT()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_158,macroName_14,(SourceLineInfo *)local_248,
             capturedExpression_14,ContinueOnFailure);
  aStack_230._8_8_ =
       *(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.boundaryIndices.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  uStack_240._1_1_ = aStack_230._8_8_ == 4;
  uStack_240._0_1_ = true;
  local_248 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d230;
  uStack_240._4_4_ = 4;
  local_238 = "==";
  aStack_230._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_158,(ITransientExpression *)local_248);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_248);
  Catch::AssertionHandler::complete((AssertionHandler *)local_158);
  if (local_128[0xb] == false) {
    (*local_118->_vptr_IResultCapture[0x13])();
  }
  local_248 = (undefined1  [8])0x1db560;
  uStack_240 = (pointer)0x391;
  macroName_15.m_size = 5;
  macroName_15.m_start = "CHECK";
  capturedExpression_15.m_size = 0x2f;
  capturedExpression_15.m_start = "1 == chunk.multiplicity().interpolants().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_158,macroName_15,(SourceLineInfo *)local_248,
             capturedExpression_15,ContinueOnFailure);
  lVar12 = (long)(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.
                 interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.
                 interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
  aStack_230._8_8_ = lVar12 >> 3;
  uStack_240._1_1_ = lVar12 == 8;
  uStack_240._0_1_ = true;
  local_248 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d270;
  uStack_240._4_4_ = 1;
  local_238 = "==";
  aStack_230._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_158,(ITransientExpression *)local_248);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_248);
  Catch::AssertionHandler::complete((AssertionHandler *)local_158);
  if (local_128[0xb] == false) {
    (*local_118->_vptr_IResultCapture[0x13])();
  }
  local_248 = (undefined1  [8])0x1db560;
  uStack_240 = (pointer)0x392;
  macroName_16.m_size = 5;
  macroName_16.m_start = "CHECK";
  capturedExpression_16.m_size = 0x2d;
  capturedExpression_16.m_start = "1 == chunk.multiplicity().boundaries().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_158,macroName_16,(SourceLineInfo *)local_248,
             capturedExpression_16,ContinueOnFailure);
  lVar12 = (long)(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.
                 boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.
                 boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
  aStack_230._8_8_ = lVar12 >> 3;
  uStack_240._1_1_ = lVar12 == 8;
  uStack_240._0_1_ = true;
  local_248 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d270;
  uStack_240._4_4_ = 1;
  local_238 = "==";
  aStack_230._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_158,(ITransientExpression *)local_248);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_248);
  Catch::AssertionHandler::complete((AssertionHandler *)local_158);
  if (local_128[0xb] == false) {
    (*local_118->_vptr_IResultCapture[0x13])();
  }
  local_248 = (undefined1  [8])0x1db560;
  uStack_240 = (pointer)0x393;
  macroName_17.m_size = 5;
  macroName_17.m_start = "CHECK";
  capturedExpression_17.m_size = 0x2b;
  capturedExpression_17.m_start = "2 == chunk.multiplicity().interpolants()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_158,macroName_17,(SourceLineInfo *)local_248,
             capturedExpression_17,ContinueOnFailure);
  aStack_230._8_8_ =
       *(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.
        interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_start;
  uStack_240._1_1_ = aStack_230._8_8_ == 2;
  uStack_240._0_1_ = true;
  local_248 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d230;
  uStack_240._4_4_ = 2;
  local_238 = "==";
  aStack_230._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_158,(ITransientExpression *)local_248);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_248);
  Catch::AssertionHandler::complete((AssertionHandler *)local_158);
  if (local_128[0xb] == false) {
    (*local_118->_vptr_IResultCapture[0x13])();
  }
  local_248 = (undefined1  [8])0x1db560;
  uStack_240 = (pointer)0x394;
  macroName_18.m_size = 5;
  macroName_18.m_start = "CHECK";
  capturedExpression_18.m_size = 0x29;
  capturedExpression_18.m_start = "4 == chunk.multiplicity().boundaries()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_158,macroName_18,(SourceLineInfo *)local_248,
             capturedExpression_18,ContinueOnFailure);
  aStack_230._8_8_ =
       *(chunk->multiplicity_).super_TabulationRecord.super_InterpolationBase.boundaryIndices.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  uStack_240._1_1_ = aStack_230._8_8_ == 4;
  uStack_240._0_1_ = true;
  local_248 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d230;
  uStack_240._4_4_ = 4;
  local_238 = "==";
  aStack_230._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_158,(ITransientExpression *)local_248);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_248);
  Catch::AssertionHandler::complete((AssertionHandler *)local_158);
  if (local_128[0xb] == false) {
    (*local_118->_vptr_IResultCapture[0x13])();
  }
  local_248 = (undefined1  [8])0x1db560;
  uStack_240 = (pointer)0x395;
  macroName_19.m_size = 5;
  macroName_19.m_start = "CHECK";
  capturedExpression_19.m_size = 0x2b;
  capturedExpression_19.m_start = "4 == chunk.multiplicity().energies().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_158,macroName_19,(SourceLineInfo *)local_248,
             capturedExpression_19,ContinueOnFailure);
  lVar12 = (long)(chunk->multiplicity_).super_TabulationRecord.xValues.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_finish -
           (long)(chunk->multiplicity_).super_TabulationRecord.xValues.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
  aStack_230._8_8_ = lVar12 >> 3;
  uStack_240._1_1_ = lVar12 == 0x20;
  uStack_240._0_1_ = true;
  local_248 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d270;
  uStack_240._4_4_ = 4;
  local_238 = "==";
  aStack_230._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_158,(ITransientExpression *)local_248);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_248);
  Catch::AssertionHandler::complete((AssertionHandler *)local_158);
  if (local_128[0xb] == false) {
    (*local_118->_vptr_IResultCapture[0x13])();
  }
  local_248 = (undefined1  [8])0x1db560;
  uStack_240 = (pointer)0x396;
  macroName_20.m_size = 5;
  macroName_20.m_start = "CHECK";
  capturedExpression_20.m_size = 0x31;
  capturedExpression_20.m_start = "4 == chunk.multiplicity().multiplicities().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_158,macroName_20,(SourceLineInfo *)local_248,
             capturedExpression_20,ContinueOnFailure);
  lVar12 = (long)(chunk->multiplicity_).super_TabulationRecord.yValues.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_finish -
           (long)(chunk->multiplicity_).super_TabulationRecord.yValues.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
  aStack_230._8_8_ = lVar12 >> 3;
  uStack_240._1_1_ = lVar12 == 0x20;
  uStack_240._0_1_ = true;
  local_248 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d270;
  uStack_240._4_4_ = 4;
  local_238 = "==";
  aStack_230._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_158,(ITransientExpression *)local_248);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_248);
  Catch::AssertionHandler::complete((AssertionHandler *)local_158);
  if (local_128[0xb] == false) {
    (*local_118->_vptr_IResultCapture[0x13])();
  }
  local_248 = (undefined1  [8])0x1db560;
  uStack_240 = (pointer)0x397;
  macroName_21.m_size = 10;
  macroName_21.m_start = "CHECK_THAT";
  capturedExpression_21.m_size = 0x35;
  capturedExpression_21.m_start = "1e-5, WithinRel( chunk.multiplicity().energies()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_158,macroName_21,(SourceLineInfo *)local_248,
             capturedExpression_21,ContinueOnFailure);
  local_200 = (undefined1  [8])0x3ee4f8b588e368f1;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_248,
             *(chunk->multiplicity_).super_TabulationRecord.xValues.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start);
  bVar11 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_248,(double *)local_200);
  uStack_290._0_2_ = CONCAT11(bVar11,true);
  local_298 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d1f0;
  local_288 = (double *)local_200;
  pWStack_280 = (WithinRelMatcher *)local_248;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_158,(ITransientExpression *)local_298);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_298);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_248);
  Catch::AssertionHandler::complete((AssertionHandler *)local_158);
  if (local_128[0xb] == false) {
    (*local_118->_vptr_IResultCapture[0x13])();
  }
  local_248 = (undefined1  [8])0x1db560;
  uStack_240 = (pointer)0x398;
  macroName_22.m_size = 10;
  macroName_22.m_start = "CHECK_THAT";
  capturedExpression_22.m_size = 0x37;
  capturedExpression_22.m_start = "1.1e+7, WithinRel( chunk.multiplicity().energies()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_158,macroName_22,(SourceLineInfo *)local_248,
             capturedExpression_22,ContinueOnFailure);
  local_200 = (undefined1  [8])0x4164fb1800000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_248,
             (chunk->multiplicity_).super_TabulationRecord.xValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[1]);
  bVar11 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_248,(double *)local_200);
  uStack_290._0_2_ = CONCAT11(bVar11,true);
  local_298 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d1f0;
  local_288 = (double *)local_200;
  pWStack_280 = (WithinRelMatcher *)local_248;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_158,(ITransientExpression *)local_298);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_298);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_248);
  Catch::AssertionHandler::complete((AssertionHandler *)local_158);
  if (local_128[0xb] == false) {
    (*local_118->_vptr_IResultCapture[0x13])();
  }
  local_248 = (undefined1  [8])0x1db560;
  uStack_240 = (pointer)0x399;
  macroName_23.m_size = 10;
  macroName_23.m_start = "CHECK_THAT";
  capturedExpression_23.m_size = 0x39;
  capturedExpression_23.m_start = "1.147e+7, WithinRel( chunk.multiplicity().energies()[2] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_158,macroName_23,(SourceLineInfo *)local_248,
             capturedExpression_23,ContinueOnFailure);
  local_200 = (undefined1  [8])0x4165e09600000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_248,
             (chunk->multiplicity_).super_TabulationRecord.xValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[2]);
  bVar11 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_248,(double *)local_200);
  uStack_290._0_2_ = CONCAT11(bVar11,true);
  local_298 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d1f0;
  local_288 = (double *)local_200;
  pWStack_280 = (WithinRelMatcher *)local_248;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_158,(ITransientExpression *)local_298);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_298);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_248);
  Catch::AssertionHandler::complete((AssertionHandler *)local_158);
  if (local_128[0xb] == false) {
    (*local_118->_vptr_IResultCapture[0x13])();
  }
  local_248 = (undefined1  [8])0x1db560;
  uStack_240 = (pointer)0x39a;
  macroName_24.m_size = 10;
  macroName_24.m_start = "CHECK_THAT";
  capturedExpression_24.m_size = 0x35;
  capturedExpression_24.m_start = "2e+7, WithinRel( chunk.multiplicity().energies()[3] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_158,macroName_24,(SourceLineInfo *)local_248,
             capturedExpression_24,ContinueOnFailure);
  local_200 = (undefined1  [8])0x417312d000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_248,
             (chunk->multiplicity_).super_TabulationRecord.xValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[3]);
  bVar11 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_248,(double *)local_200);
  uStack_290._0_2_ = CONCAT11(bVar11,true);
  local_298 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d1f0;
  local_288 = (double *)local_200;
  pWStack_280 = (WithinRelMatcher *)local_248;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_158,(ITransientExpression *)local_298);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_298);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_248);
  Catch::AssertionHandler::complete((AssertionHandler *)local_158);
  if (local_128[0xb] == false) {
    (*local_118->_vptr_IResultCapture[0x13])();
  }
  local_248 = (undefined1  [8])0x1db560;
  uStack_240 = (pointer)0x39b;
  macroName_25.m_size = 10;
  macroName_25.m_start = "CHECK_THAT";
  capturedExpression_25.m_size = 0x39;
  capturedExpression_25.m_start = "0., WithinRel( chunk.multiplicity().multiplicities()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_158,macroName_25,(SourceLineInfo *)local_248,
             capturedExpression_25,ContinueOnFailure);
  local_200 = (undefined1  [8])0x0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_248,
             *(chunk->multiplicity_).super_TabulationRecord.yValues.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start);
  bVar11 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_248,(double *)local_200);
  uStack_290._0_2_ = CONCAT11(bVar11,true);
  local_298 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d1f0;
  local_288 = (double *)local_200;
  pWStack_280 = (WithinRelMatcher *)local_248;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_158,(ITransientExpression *)local_298);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_298);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_248);
  Catch::AssertionHandler::complete((AssertionHandler *)local_158);
  if (local_128[0xb] == false) {
    (*local_118->_vptr_IResultCapture[0x13])();
  }
  local_248 = (undefined1  [8])0x1db560;
  uStack_240 = (pointer)0x39c;
  macroName_26.m_size = 10;
  macroName_26.m_start = "CHECK_THAT";
  capturedExpression_26.m_size = 0x42;
  capturedExpression_26.m_start =
       "8.45368e-11, WithinRel( chunk.multiplicity().multiplicities()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_158,macroName_26,(SourceLineInfo *)local_248,
             capturedExpression_26,ContinueOnFailure);
  local_200 = (undefined1  [8])0x3dd73cbf9a9a437f;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_248,
             (chunk->multiplicity_).super_TabulationRecord.yValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[1]);
  bVar11 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_248,(double *)local_200);
  uStack_290._0_2_ = CONCAT11(bVar11,true);
  local_298 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d1f0;
  local_288 = (double *)local_200;
  pWStack_280 = (WithinRelMatcher *)local_248;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_158,(ITransientExpression *)local_298);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_298);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_248);
  Catch::AssertionHandler::complete((AssertionHandler *)local_158);
  if (local_128[0xb] == false) {
    (*local_118->_vptr_IResultCapture[0x13])();
  }
  local_248 = (undefined1  [8])0x1db560;
  uStack_240 = (pointer)0x39d;
  macroName_27.m_size = 10;
  macroName_27.m_start = "CHECK_THAT";
  capturedExpression_27.m_size = 0x42;
  capturedExpression_27.m_start =
       "6.622950e-8, WithinRel( chunk.multiplicity().multiplicities()[2] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_158,macroName_27,(SourceLineInfo *)local_248,
             capturedExpression_27,ContinueOnFailure);
  local_200 = (undefined1  [8])0x3e71c741af855bf3;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_248,
             (chunk->multiplicity_).super_TabulationRecord.yValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[2]);
  bVar11 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_248,(double *)local_200);
  uStack_290._0_2_ = CONCAT11(bVar11,true);
  local_298 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d1f0;
  local_288 = (double *)local_200;
  pWStack_280 = (WithinRelMatcher *)local_248;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_158,(ITransientExpression *)local_298);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_298);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_248);
  Catch::AssertionHandler::complete((AssertionHandler *)local_158);
  if (local_128[0xb] == false) {
    (*local_118->_vptr_IResultCapture[0x13])();
  }
  local_248 = (undefined1  [8])0x1db560;
  uStack_240 = (pointer)0x39e;
  macroName_28.m_size = 10;
  macroName_28.m_start = "CHECK_THAT";
  capturedExpression_28.m_size = 0x42;
  capturedExpression_28.m_start =
       "2.149790e-1, WithinRel( chunk.multiplicity().multiplicities()[3] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_158,macroName_28,(SourceLineInfo *)local_248,
             capturedExpression_28,ContinueOnFailure);
  local_200 = (undefined1  [8])0x3fcb846e8f29d40f;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_248,
             (chunk->multiplicity_).super_TabulationRecord.yValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[3]);
  bVar11 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_248,(double *)local_200);
  uStack_290._0_2_ = CONCAT11(bVar11,true);
  local_298 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d1f0;
  local_288 = (double *)local_200;
  pWStack_280 = (WithinRelMatcher *)local_248;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_158,(ITransientExpression *)local_298);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_298);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_248);
  Catch::AssertionHandler::complete((AssertionHandler *)local_158);
  if (local_128[0xb] == false) {
    (*local_118->_vptr_IResultCapture[0x13])();
  }
  pvVar13 = std::
            get<2ul,njoy::ENDFtk::section::Type<6>::DefinedElsewhere,njoy::ENDFtk::section::Type<6>::Unknown,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                      (&chunk->law_);
  local_158._0_8_ =
       *(undefined8 *)
        &(pvVar13->data_).interpolation_.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>;
  local_158._8_8_ =
       (pvVar13->data_).interpolation_.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
  local_158._16_8_ =
       (pvVar13->data_).interpolation_.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl;
  local_158._24_8_ =
       (pvVar13->data_).interpolation_.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl;
  local_158._32_8_ =
       (pvVar13->data_).interpolation_.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl;
  local_158._40_8_ =
       (pvVar13->data_).interpolation_.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)local_128,
             &(pvVar13->data_).interpolation_.super_InterpolationBase.boundaryIndices);
  std::vector<long,_std::allocator<long>_>::vector
            (&local_110,
             &(pvVar13->data_).interpolation_.super_InterpolationBase.interpolationSchemeIndices);
  std::
  vector<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>_>
  ::vector(&local_f8,&(pvVar13->data_).sequence_);
  local_298 = (undefined1  [8])0x1db560;
  uStack_290 = 0x3a2;
  macroName_29.m_size = 5;
  macroName_29.m_start = "CHECK";
  capturedExpression_29.m_size = 0xe;
  capturedExpression_29.m_start = "1 == law.LAW()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_248,macroName_29,(SourceLineInfo *)local_298,
             capturedExpression_29,ContinueOnFailure);
  uStack_290 = CONCAT62(uStack_290._2_6_,0x101);
  local_298 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d1b0;
  uStack_290 = CONCAT44(1,(undefined4)uStack_290);
  local_288 = (double *)0x1e05de;
  pWStack_280 = (WithinRelMatcher *)0x2;
  local_278 = (char *)CONCAT44(local_278._4_4_,1);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_248,(ITransientExpression *)local_298);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_298);
  Catch::AssertionHandler::complete((AssertionHandler *)local_248);
  if (local_218[0xb] == false) {
    (*local_208->_vptr_IResultCapture[0x13])();
  }
  local_298 = (undefined1  [8])0x1db560;
  uStack_290 = 0x3a3;
  macroName_30.m_size = 5;
  macroName_30.m_start = "CHECK";
  capturedExpression_30.m_size = 0xe;
  capturedExpression_30.m_start = "2 == law.LEP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_248,macroName_30,(SourceLineInfo *)local_298,
             capturedExpression_30,ContinueOnFailure);
  uStack_290._0_2_ = CONCAT11(local_158._16_4_ == 2,true);
  local_298 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d1b0;
  uStack_290 = CONCAT44(2,(undefined4)uStack_290);
  local_288 = (double *)0x1e05de;
  pWStack_280 = (WithinRelMatcher *)0x2;
  local_278 = (char *)CONCAT44(local_278._4_4_,local_158._16_4_);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_248,(ITransientExpression *)local_298);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_298);
  Catch::AssertionHandler::complete((AssertionHandler *)local_248);
  if (local_218[0xb] == false) {
    (*local_208->_vptr_IResultCapture[0x13])();
  }
  local_298 = (undefined1  [8])0x1db560;
  uStack_290 = 0x3a4;
  macroName_31.m_size = 5;
  macroName_31.m_start = "CHECK";
  capturedExpression_31.m_size = 0xd;
  capturedExpression_31.m_start = "2 == law.NE()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_248,macroName_31,(SourceLineInfo *)local_298,
             capturedExpression_31,ContinueOnFailure);
  local_278 = *(char **)(CONCAT44(local_128._12_4_,local_128._8_4_) + -8);
  uStack_290._0_2_ = CONCAT11(local_278 == (char *)0x2,true);
  local_298 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d230;
  uStack_290 = CONCAT44(2,(undefined4)uStack_290);
  local_288 = (double *)0x1e05de;
  pWStack_280 = (WithinRelMatcher *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_248,(ITransientExpression *)local_298);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_298);
  Catch::AssertionHandler::complete((AssertionHandler *)local_248);
  if (local_218[0xb] == false) {
    (*local_208->_vptr_IResultCapture[0x13])();
  }
  local_298 = (undefined1  [8])0x1db560;
  uStack_290 = 0x3a5;
  macroName_32.m_size = 5;
  macroName_32.m_start = "CHECK";
  capturedExpression_32.m_size = 0x21;
  capturedExpression_32.m_start = "2 == law.numberIncidentEnergies()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_248,macroName_32,(SourceLineInfo *)local_298,
             capturedExpression_32,ContinueOnFailure);
  local_278 = *(char **)(CONCAT44(local_128._12_4_,local_128._8_4_) + -8);
  uStack_290._0_2_ = CONCAT11(local_278 == (char *)0x2,true);
  local_298 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d230;
  uStack_290 = CONCAT44(2,(undefined4)uStack_290);
  local_288 = (double *)0x1e05de;
  pWStack_280 = (WithinRelMatcher *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_248,(ITransientExpression *)local_298);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_298);
  Catch::AssertionHandler::complete((AssertionHandler *)local_248);
  if (local_218[0xb] == false) {
    (*local_208->_vptr_IResultCapture[0x13])();
  }
  local_298 = (undefined1  [8])0x1db560;
  uStack_290 = 0x3a6;
  macroName_33.m_size = 5;
  macroName_33.m_start = "CHECK";
  capturedExpression_33.m_size = 0xd;
  capturedExpression_33.m_start = "1 == law.NR()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_248,macroName_33,(SourceLineInfo *)local_298,
             capturedExpression_33,ContinueOnFailure);
  lVar12 = CONCAT44(local_128._12_4_,local_128._8_4_) - local_128._0_8_;
  local_278 = (char *)(lVar12 >> 3);
  uStack_290._0_2_ = CONCAT11(lVar12 == 8,true);
  local_298 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d230;
  uStack_290 = CONCAT44(1,(undefined4)uStack_290);
  local_288 = (double *)0x1e05de;
  pWStack_280 = (WithinRelMatcher *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_248,(ITransientExpression *)local_298);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_298);
  Catch::AssertionHandler::complete((AssertionHandler *)local_248);
  if (local_218[0xb] == false) {
    (*local_208->_vptr_IResultCapture[0x13])();
  }
  local_298 = (undefined1  [8])0x1db560;
  uStack_290 = 0x3a7;
  macroName_34.m_size = 5;
  macroName_34.m_start = "CHECK";
  capturedExpression_34.m_size = 0x25;
  capturedExpression_34.m_start = "1 == law.numberInterpolationRegions()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_248,macroName_34,(SourceLineInfo *)local_298,
             capturedExpression_34,ContinueOnFailure);
  lVar12 = CONCAT44(local_128._12_4_,local_128._8_4_) - local_128._0_8_;
  local_278 = (char *)(lVar12 >> 3);
  uStack_290._0_2_ = CONCAT11(lVar12 == 8,true);
  local_298 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d230;
  uStack_290 = CONCAT44(1,(undefined4)uStack_290);
  local_288 = (double *)0x1e05de;
  pWStack_280 = (WithinRelMatcher *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_248,(ITransientExpression *)local_298);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_298);
  Catch::AssertionHandler::complete((AssertionHandler *)local_248);
  if (local_218[0xb] == false) {
    (*local_208->_vptr_IResultCapture[0x13])();
  }
  local_298 = (undefined1  [8])0x1db560;
  uStack_290 = 0x3a8;
  macroName_35.m_size = 5;
  macroName_35.m_start = "CHECK";
  capturedExpression_35.m_size = 0x15;
  capturedExpression_35.m_start = "1 == law.INT().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_248,macroName_35,(SourceLineInfo *)local_298,
             capturedExpression_35,ContinueOnFailure);
  local_278 = (char *)((long)local_110.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_110.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_start >> 3);
  uStack_290._0_2_ =
       CONCAT11((long)local_110.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_110.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start == 8,true);
  local_298 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d270;
  uStack_290 = CONCAT44(1,(undefined4)uStack_290);
  local_288 = (double *)0x1e05de;
  pWStack_280 = (WithinRelMatcher *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_248,(ITransientExpression *)local_298);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_298);
  Catch::AssertionHandler::complete((AssertionHandler *)local_248);
  if (local_218[0xb] == false) {
    (*local_208->_vptr_IResultCapture[0x13])();
  }
  local_298 = (undefined1  [8])0x1db560;
  uStack_290 = 0x3a9;
  macroName_36.m_size = 5;
  macroName_36.m_start = "CHECK";
  capturedExpression_36.m_size = 0x15;
  capturedExpression_36.m_start = "1 == law.NBT().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_248,macroName_36,(SourceLineInfo *)local_298,
             capturedExpression_36,ContinueOnFailure);
  lVar12 = CONCAT44(local_128._12_4_,local_128._8_4_) - local_128._0_8_;
  local_278 = (char *)(lVar12 >> 3);
  uStack_290._0_2_ = CONCAT11(lVar12 == 8,true);
  local_298 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d270;
  uStack_290 = CONCAT44(1,(undefined4)uStack_290);
  local_288 = (double *)0x1e05de;
  pWStack_280 = (WithinRelMatcher *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_248,(ITransientExpression *)local_298);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_298);
  Catch::AssertionHandler::complete((AssertionHandler *)local_248);
  if (local_218[0xb] == false) {
    (*local_208->_vptr_IResultCapture[0x13])();
  }
  local_298 = (undefined1  [8])0x1db560;
  uStack_290 = 0x3aa;
  macroName_37.m_size = 5;
  macroName_37.m_start = "CHECK";
  capturedExpression_37.m_size = 0x11;
  capturedExpression_37.m_start = "1 == law.INT()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_248,macroName_37,(SourceLineInfo *)local_298,
             capturedExpression_37,ContinueOnFailure);
  local_278 = (char *)*local_110.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start;
  uStack_290._0_2_ = CONCAT11(local_278 == (char *)0x1,true);
  local_298 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d230;
  uStack_290 = CONCAT44(1,(undefined4)uStack_290);
  local_288 = (double *)0x1e05de;
  pWStack_280 = (WithinRelMatcher *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_248,(ITransientExpression *)local_298);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_298);
  Catch::AssertionHandler::complete((AssertionHandler *)local_248);
  if (local_218[0xb] == false) {
    (*local_208->_vptr_IResultCapture[0x13])();
  }
  local_298 = (undefined1  [8])0x1db560;
  uStack_290 = 0x3ab;
  macroName_38.m_size = 5;
  macroName_38.m_start = "CHECK";
  capturedExpression_38.m_size = 0x11;
  capturedExpression_38.m_start = "2 == law.NBT()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_248,macroName_38,(SourceLineInfo *)local_298,
             capturedExpression_38,ContinueOnFailure);
  local_278 = *(char **)local_128._0_8_;
  uStack_290._0_2_ = CONCAT11(local_278 == (char *)0x2,true);
  local_298 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d230;
  uStack_290 = CONCAT44(2,(undefined4)uStack_290);
  local_288 = (double *)0x1e05de;
  pWStack_280 = (WithinRelMatcher *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_248,(ITransientExpression *)local_298);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_298);
  Catch::AssertionHandler::complete((AssertionHandler *)local_248);
  if (local_218[0xb] == false) {
    (*local_208->_vptr_IResultCapture[0x13])();
  }
  local_298 = (undefined1  [8])0x1db560;
  uStack_290 = 0x3ac;
  macroName_39.m_size = 5;
  macroName_39.m_start = "CHECK";
  capturedExpression_39.m_size = 0x1e;
  capturedExpression_39.m_start = "1 == law.interpolants().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_248,macroName_39,(SourceLineInfo *)local_298,
             capturedExpression_39,ContinueOnFailure);
  local_278 = (char *)((long)local_110.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_110.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_start >> 3);
  uStack_290._0_2_ =
       CONCAT11((long)local_110.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_110.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start == 8,true);
  local_298 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d270;
  uStack_290 = CONCAT44(1,(undefined4)uStack_290);
  local_288 = (double *)0x1e05de;
  pWStack_280 = (WithinRelMatcher *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_248,(ITransientExpression *)local_298);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_298);
  Catch::AssertionHandler::complete((AssertionHandler *)local_248);
  if (local_218[0xb] == false) {
    (*local_208->_vptr_IResultCapture[0x13])();
  }
  local_298 = (undefined1  [8])0x1db560;
  uStack_290 = 0x3ad;
  macroName_40.m_size = 5;
  macroName_40.m_start = "CHECK";
  capturedExpression_40.m_size = 0x1c;
  capturedExpression_40.m_start = "1 == law.boundaries().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_248,macroName_40,(SourceLineInfo *)local_298,
             capturedExpression_40,ContinueOnFailure);
  lVar12 = CONCAT44(local_128._12_4_,local_128._8_4_) - local_128._0_8_;
  local_278 = (char *)(lVar12 >> 3);
  uStack_290._0_2_ = CONCAT11(lVar12 == 8,true);
  local_298 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d270;
  uStack_290 = CONCAT44(1,(undefined4)uStack_290);
  local_288 = (double *)0x1e05de;
  pWStack_280 = (WithinRelMatcher *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_248,(ITransientExpression *)local_298);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_298);
  Catch::AssertionHandler::complete((AssertionHandler *)local_248);
  if (local_218[0xb] == false) {
    (*local_208->_vptr_IResultCapture[0x13])();
  }
  local_298 = (undefined1  [8])0x1db560;
  uStack_290 = 0x3ae;
  macroName_41.m_size = 5;
  macroName_41.m_start = "CHECK";
  capturedExpression_41.m_size = 0x1a;
  capturedExpression_41.m_start = "1 == law.interpolants()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_248,macroName_41,(SourceLineInfo *)local_298,
             capturedExpression_41,ContinueOnFailure);
  local_278 = (char *)*local_110.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start;
  uStack_290._0_2_ = CONCAT11(local_278 == (char *)0x1,true);
  local_298 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d230;
  uStack_290 = CONCAT44(1,(undefined4)uStack_290);
  local_288 = (double *)0x1e05de;
  pWStack_280 = (WithinRelMatcher *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_248,(ITransientExpression *)local_298);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_298);
  Catch::AssertionHandler::complete((AssertionHandler *)local_248);
  if (local_218[0xb] == false) {
    (*local_208->_vptr_IResultCapture[0x13])();
  }
  local_298 = (undefined1  [8])0x1db560;
  uStack_290 = 0x3af;
  macroName_42.m_size = 5;
  macroName_42.m_start = "CHECK";
  capturedExpression_42.m_size = 0x18;
  capturedExpression_42.m_start = "2 == law.boundaries()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_248,macroName_42,(SourceLineInfo *)local_298,
             capturedExpression_42,ContinueOnFailure);
  local_278 = *(char **)local_128._0_8_;
  uStack_290._0_2_ = CONCAT11(local_278 == (char *)0x2,true);
  local_298 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d230;
  uStack_290 = CONCAT44(2,(undefined4)uStack_290);
  local_288 = (double *)0x1e05de;
  pWStack_280 = (WithinRelMatcher *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_248,(ITransientExpression *)local_298);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_298);
  Catch::AssertionHandler::complete((AssertionHandler *)local_248);
  if (local_218[0xb] == false) {
    (*local_208->_vptr_IResultCapture[0x13])();
  }
  pvVar14 = std::
            get<0ul,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>
                      (local_f8.
                       super__Vector_base<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  local_248 = *(undefined1 (*) [8])
               &(pvVar14->super_Base).super_ListRecord.metadata.fields.
                super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                super__Tuple_impl<2UL,_long,_long,_long,_long>;
  uStack_240 = (pointer)(pvVar14->super_Base).super_ListRecord.metadata.fields.
                        super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                        super__Tuple_impl<2UL,_long,_long,_long,_long>.
                        super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
                        super__Head_base<4UL,_long,_false>._M_head_impl;
  local_238 = (char *)(pvVar14->super_Base).super_ListRecord.metadata.fields.
                      super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                      super__Tuple_impl<2UL,_long,_long,_long,_long>.
                      super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
                      _M_head_impl;
  aStack_230._M_allocated_capacity =
       (pvVar14->super_Base).super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl;
  aStack_230._8_8_ =
       (pvVar14->super_Base).super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl;
  dStack_220 = (pvVar14->super_Base).super_ListRecord.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Head_base<0UL,_double,_false>._M_head_impl;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_218,
             &(pvVar14->super_Base).super_ListRecord.data);
  local_200 = (undefined1  [8])0x1db560;
  local_1f8 = (pointer)0x3b5;
  macroName_43.m_size = 10;
  macroName_43.m_start = "CHECK_THAT";
  capturedExpression_43.m_size = 0x2f;
  capturedExpression_43.m_start = "1e-5, WithinRel( subsection1.incidentEnergy() )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_298,macroName_43,(SourceLineInfo *)local_200,
             capturedExpression_43,ContinueOnFailure);
  local_180._0_8_ = (_func_int **)0x3ee4f8b588e368f1;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_200,(double)aStack_230._8_8_);
  bVar11 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_200,(double *)local_180);
  local_1b0._1_1_ = bVar11;
  local_1b0._0_1_ = true;
  local_1b8 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d1f0;
  local_1a8 = (double *)local_180;
  local_1a0[0]._0_8_ = (WithinRelMatcher *)local_200;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_298,(ITransientExpression *)local_1b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_298);
  if (local_268[0xb] == false) {
    (*local_258->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1db560;
  local_1f8 = (pointer)0x3b6;
  macroName_44.m_size = 5;
  macroName_44.m_start = "CHECK";
  capturedExpression_44.m_size = 0x15;
  capturedExpression_44.m_start = "0 == subsection1.ND()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_298,macroName_44,(SourceLineInfo *)local_200,
             capturedExpression_44,ContinueOnFailure);
  local_1f8._1_1_ = aStack_230._M_allocated_capacity == 0;
  local_1f8._0_1_ = true;
  local_200 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d230;
  local_1f8 = local_1f8 & 0xffffffff;
  local_1f0 = "==";
  local_1e8[0]._M_allocated_capacity = 2;
  local_1e8[0]._8_8_ = aStack_230._M_allocated_capacity;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_298,(ITransientExpression *)local_200);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_298);
  if (local_268[0xb] == false) {
    (*local_258->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1db560;
  local_1f8 = (pointer)0x3b7;
  macroName_45.m_size = 5;
  macroName_45.m_start = "CHECK";
  capturedExpression_45.m_size = 0x15;
  capturedExpression_45.m_start = "1 == subsection1.NA()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_298,macroName_45,(SourceLineInfo *)local_200,
             capturedExpression_45,ContinueOnFailure);
  local_1f8._1_1_ = local_238 == (char *)0x1;
  local_1f8._0_1_ = true;
  local_200 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d230;
  local_1f8._4_4_ = 1;
  local_1f0 = "==";
  local_1e8[0]._M_allocated_capacity = 2;
  local_1e8[0]._8_8_ = local_238;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_298,(ITransientExpression *)local_200);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_298);
  if (local_268[0xb] == false) {
    (*local_258->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1db560;
  local_1f8 = (pointer)0x3b8;
  macroName_46.m_size = 5;
  macroName_46.m_start = "CHECK";
  capturedExpression_46.m_size = 0x16;
  capturedExpression_46.m_start = "12 == subsection1.NW()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_298,macroName_46,(SourceLineInfo *)local_200,
             capturedExpression_46,ContinueOnFailure);
  lVar12 = CONCAT44(local_218._12_4_,local_218._8_4_) - local_218._0_8_;
  local_1e8[0]._8_8_ = lVar12 >> 3;
  local_1f8._1_1_ = lVar12 == 0x60;
  local_1f8._0_1_ = true;
  local_200 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d230;
  local_1f8._4_4_ = 0xc;
  local_1f0 = "==";
  local_1e8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_298,(ITransientExpression *)local_200);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_298);
  if (local_268[0xb] == false) {
    (*local_258->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1db560;
  local_1f8 = (pointer)0x3b9;
  macroName_47.m_size = 5;
  macroName_47.m_start = "CHECK";
  capturedExpression_47.m_size = 0x16;
  capturedExpression_47.m_start = "4 == subsection1.NEP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_298,macroName_47,(SourceLineInfo *)local_200,
             capturedExpression_47,ContinueOnFailure);
  local_1f8._1_1_ = local_248 == (undefined1  [8])0x4;
  local_1f8._0_1_ = true;
  local_200 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d230;
  local_1f8._4_4_ = 4;
  local_1f0 = "==";
  local_1e8[0]._M_allocated_capacity = 2;
  local_1e8[0]._8_8_ = local_248;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_298,(ITransientExpression *)local_200);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_298);
  if (local_268[0xb] == false) {
    (*local_258->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1db560;
  local_1f8 = (pointer)0x3ba;
  macroName_48.m_size = 5;
  macroName_48.m_start = "CHECK";
  capturedExpression_48.m_size = 0x22;
  capturedExpression_48.m_start = "4 == subsection1.energies().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_298,macroName_48,(SourceLineInfo *)local_200,
             capturedExpression_48,ContinueOnFailure);
  local_1e8[0]._8_8_ =
       (ulong)(local_238 + (CONCAT44(local_218._12_4_,local_218._8_4_) - local_218._0_8_ >> 3) + 1)
       / (ulong)(local_238 + 2);
  local_1f8._1_1_ = local_1e8[0]._8_8_ == 4;
  local_1f8._0_1_ = true;
  local_200 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d270;
  local_1f8._4_4_ = 4;
  local_1f0 = "==";
  local_1e8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_298,(ITransientExpression *)local_200);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_298);
  if (local_268[0xb] == false) {
    (*local_258->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1db560;
  local_1f8 = (pointer)0x3bb;
  macroName_49.m_size = 10;
  macroName_49.m_start = "CHECK_THAT";
  capturedExpression_49.m_size = 0x2a;
  capturedExpression_49.m_start = "1., WithinRel( subsection1.energies()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_298,macroName_49,(SourceLineInfo *)local_200,
             capturedExpression_49,ContinueOnFailure);
  local_180._0_8_ = (_func_int **)0x3ff0000000000000;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_200,*(double *)local_218._0_8_);
  bVar11 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_200,(double *)local_180);
  local_1b0._1_1_ = bVar11;
  local_1b0._0_1_ = true;
  local_1b8 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d1f0;
  local_1a8 = (double *)local_180;
  local_1a0[0]._0_8_ = (WithinRelMatcher *)local_200;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_298,(ITransientExpression *)local_1b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_298);
  if (local_268[0xb] == false) {
    (*local_258->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1db560;
  local_1f8 = (pointer)0x3bc;
  macroName_50.m_size = 10;
  macroName_50.m_start = "CHECK_THAT";
  capturedExpression_50.m_size = 0x2a;
  capturedExpression_50.m_start = "4., WithinRel( subsection1.energies()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_298,macroName_50,(SourceLineInfo *)local_200,
             capturedExpression_50,ContinueOnFailure);
  local_d8._0_8_ = (_func_int **)0x4010000000000000;
  local_170 = (iterator_t<CRng> *)(local_238 + 2);
  lVar12 = CONCAT44(local_218._12_4_,local_218._8_4_) - local_218._0_8_;
  auVar2._8_8_ = lVar12 >> 0x3f;
  auVar2._0_8_ = lVar12 >> 3;
  lVar12 = SUB168(auVar2 % SEXT816((long)local_170),0);
  local_168 = (WithinRelMatcher *)((long)local_170 - lVar12);
  if (lVar12 == 0) {
    local_168 = (WithinRelMatcher *)0x0;
  }
  local_a0._M_current = (double *)local_218._0_8_;
  unique0x10006cb8 = (vector<double,_std::allocator<double>_> *)local_218;
  local_98 = local_180;
  ranges::stride_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>::
  adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_98,&local_a0,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_200,*local_a0._M_current);
  bVar11 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_200,(double *)local_d8);
  local_1b0._1_1_ = bVar11;
  local_1b0._0_1_ = true;
  local_1b8 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d1f0;
  local_1a8 = (double *)local_d8;
  local_1a0[0]._0_8_ = (WithinRelMatcher *)local_200;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_298,(ITransientExpression *)local_1b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_298);
  if (local_268[0xb] == false) {
    (*local_258->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1db560;
  local_1f8 = (pointer)0x3bd;
  macroName_51.m_size = 10;
  macroName_51.m_start = "CHECK_THAT";
  capturedExpression_51.m_size = 0x2a;
  capturedExpression_51.m_start = "7., WithinRel( subsection1.energies()[2] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_298,macroName_51,(SourceLineInfo *)local_200,
             capturedExpression_51,ContinueOnFailure);
  local_d8._0_8_ = (_func_int **)0x401c000000000000;
  local_170 = (iterator_t<CRng> *)(local_238 + 2);
  lVar12 = CONCAT44(local_218._12_4_,local_218._8_4_) - local_218._0_8_;
  auVar3._8_8_ = lVar12 >> 0x3f;
  auVar3._0_8_ = lVar12 >> 3;
  lVar12 = SUB168(auVar3 % SEXT816((long)local_170),0);
  local_168 = (WithinRelMatcher *)((long)local_170 - lVar12);
  if (lVar12 == 0) {
    local_168 = (WithinRelMatcher *)0x0;
  }
  local_90._M_current = (double *)local_218._0_8_;
  unique0x10006cc0 = (vector<double,_std::allocator<double>_> *)local_218;
  local_88 = local_180;
  ranges::stride_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>::
  adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_88,&local_90,2);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_200,*local_90._M_current);
  bVar11 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_200,(double *)local_d8);
  local_1b0._1_1_ = bVar11;
  local_1b0._0_1_ = true;
  local_1b8 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d1f0;
  local_1a8 = (double *)local_d8;
  local_1a0[0]._0_8_ = (WithinRelMatcher *)local_200;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_298,(ITransientExpression *)local_1b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_298);
  if (local_268[0xb] == false) {
    (*local_258->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1db560;
  local_1f8 = (pointer)0x3be;
  macroName_52.m_size = 10;
  macroName_52.m_start = "CHECK_THAT";
  capturedExpression_52.m_size = 0x2b;
  capturedExpression_52.m_start = "10., WithinRel( subsection1.energies()[3] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_298,macroName_52,(SourceLineInfo *)local_200,
             capturedExpression_52,ContinueOnFailure);
  local_d8._0_8_ = (_func_int **)0x4024000000000000;
  local_170 = (iterator_t<CRng> *)(local_238 + 2);
  lVar12 = CONCAT44(local_218._12_4_,local_218._8_4_) - local_218._0_8_;
  auVar4._8_8_ = lVar12 >> 0x3f;
  auVar4._0_8_ = lVar12 >> 3;
  lVar12 = SUB168(auVar4 % SEXT816((long)local_170),0);
  local_168 = (WithinRelMatcher *)((long)local_170 - lVar12);
  if (lVar12 == 0) {
    local_168 = (WithinRelMatcher *)0x0;
  }
  local_80._M_current = (double *)local_218._0_8_;
  unique0x10006cc8 = (vector<double,_std::allocator<double>_> *)local_218;
  local_78 = local_180;
  ranges::stride_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>::
  adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_78,&local_80,3);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_200,*local_80._M_current);
  bVar11 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_200,(double *)local_d8);
  local_1b0._1_1_ = bVar11;
  local_1b0._0_1_ = true;
  local_1b8 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d1f0;
  local_1a8 = (double *)local_d8;
  local_1a0[0]._0_8_ = (WithinRelMatcher *)local_200;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_298,(ITransientExpression *)local_1b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_298);
  if (local_268[0xb] == false) {
    (*local_258->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1db560;
  local_1f8 = (pointer)0x3bf;
  macroName_53.m_size = 5;
  macroName_53.m_start = "CHECK";
  capturedExpression_53.m_size = 0x26;
  capturedExpression_53.m_start = "4 == subsection1.coefficients().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_298,macroName_53,(SourceLineInfo *)local_200,
             capturedExpression_53,ContinueOnFailure);
  uVar15 = CONCAT44(local_218._12_4_,local_218._8_4_) - local_218._0_8_ >> 3;
  local_1e8[0]._8_8_ =
       (uVar15 / (ulong)(local_238 + 2) + 1) - (ulong)(uVar15 % (ulong)(local_238 + 2) == 0);
  local_1f8._1_1_ = local_1e8[0]._8_8_ == 4;
  local_1f8._0_1_ = true;
  local_200 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d270;
  local_1f8._4_4_ = 4;
  local_1f0 = "==";
  local_1e8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_298,(ITransientExpression *)local_200);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_298);
  if (local_268[0xb] == false) {
    (*local_258->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1db560;
  local_1f8 = (pointer)0x3c0;
  macroName_54.m_size = 10;
  macroName_54.m_start = "CHECK_THAT";
  capturedExpression_54.m_size = 0x31;
  capturedExpression_54.m_start = "2., WithinRel( subsection1.coefficients()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_298,macroName_54,(SourceLineInfo *)local_200,
             capturedExpression_54,ContinueOnFailure);
  local_180._0_8_ = (_func_int **)0x4000000000000000;
  pcVar17 = (char *)(CONCAT44(local_218._12_4_,local_218._8_4_) - local_218._0_8_ >> 3);
  if (local_238 + 2 < pcVar17) {
    pcVar17 = local_238 + 2;
  }
  lVar12 = 8;
  if (pcVar17 < (char *)0x2) {
    lVar12 = (long)pcVar17 * 8;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_200,*(double *)(local_218._0_8_ + lVar12));
  bVar11 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_200,(double *)local_180);
  local_1b0._1_1_ = bVar11;
  local_1b0._0_1_ = true;
  local_1b8 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d1f0;
  local_1a8 = (double *)local_180;
  local_1a0[0]._0_8_ = (WithinRelMatcher *)local_200;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_298,(ITransientExpression *)local_1b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_298);
  if (local_268[0xb] == false) {
    (*local_258->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1db560;
  local_1f8 = (pointer)0x3c1;
  macroName_55.m_size = 10;
  macroName_55.m_start = "CHECK_THAT";
  capturedExpression_55.m_size = 0x31;
  capturedExpression_55.m_start = "3., WithinRel( subsection1.coefficients()[0][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_298,macroName_55,(SourceLineInfo *)local_200,
             capturedExpression_55,ContinueOnFailure);
  local_180._0_8_ = (_func_int **)0x4008000000000000;
  pcVar17 = (char *)(CONCAT44(local_218._12_4_,local_218._8_4_) - local_218._0_8_ >> 3);
  if (local_238 + 2 < pcVar17) {
    pcVar17 = local_238 + 2;
  }
  lVar12 = 8;
  if (pcVar17 < (char *)0x2) {
    lVar12 = (long)pcVar17 * 8;
  }
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_200,*(double *)(local_218._0_8_ + lVar12 + 8));
  bVar11 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_200,(double *)local_180);
  local_1b0._1_1_ = bVar11;
  local_1b0._0_1_ = true;
  local_1b8 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d1f0;
  local_1a8 = (double *)local_180;
  local_1a0[0]._0_8_ = (WithinRelMatcher *)local_200;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_298,(ITransientExpression *)local_1b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_298);
  if (local_268[0xb] == false) {
    (*local_258->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1db560;
  local_1f8 = (pointer)0x3c2;
  macroName_56.m_size = 10;
  macroName_56.m_start = "CHECK_THAT";
  capturedExpression_56.m_size = 0x31;
  capturedExpression_56.m_start = "5., WithinRel( subsection1.coefficients()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_298,macroName_56,(SourceLineInfo *)local_200,
             capturedExpression_56,ContinueOnFailure);
  pcVar17 = local_238 + 2;
  pdVar10 = (double *)CONCAT44(local_218._12_4_,local_218._8_4_);
  pdVar16 = (double *)(local_218._0_8_ + (local_238 + 2) * 8);
  if ((long)pdVar10 - local_218._0_8_ >> 3 <= (long)pcVar17) {
    pdVar16 = pdVar10;
  }
  local_180._0_8_ = (_func_int **)0x4014000000000000;
  pcVar18 = (char *)((long)pdVar10 - (long)pdVar16 >> 3);
  if (pcVar17 < pcVar18) {
    pcVar18 = pcVar17;
  }
  lVar12 = 8;
  if (pcVar18 < (char *)0x2) {
    lVar12 = (long)pcVar18 * 8;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_200,*(double *)((long)pdVar16 + lVar12));
  bVar11 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_200,(double *)local_180);
  local_1b0._1_1_ = bVar11;
  local_1b0._0_1_ = true;
  local_1b8 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d1f0;
  local_1a8 = (double *)local_180;
  local_1a0[0]._0_8_ = (WithinRelMatcher *)local_200;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_298,(ITransientExpression *)local_1b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_298);
  if (local_268[0xb] == false) {
    (*local_258->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1db560;
  local_1f8 = (pointer)0x3c3;
  macroName_57.m_size = 10;
  macroName_57.m_start = "CHECK_THAT";
  capturedExpression_57.m_size = 0x31;
  capturedExpression_57.m_start = "6., WithinRel( subsection1.coefficients()[1][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_298,macroName_57,(SourceLineInfo *)local_200,
             capturedExpression_57,ContinueOnFailure);
  pcVar17 = local_238 + 2;
  pdVar10 = (double *)CONCAT44(local_218._12_4_,local_218._8_4_);
  pdVar16 = (double *)(local_218._0_8_ + (local_238 + 2) * 8);
  if ((long)pdVar10 - local_218._0_8_ >> 3 <= (long)pcVar17) {
    pdVar16 = pdVar10;
  }
  local_180._0_8_ = (_func_int **)0x4018000000000000;
  pcVar18 = (char *)((long)pdVar10 - (long)pdVar16 >> 3);
  if (pcVar17 < pcVar18) {
    pcVar18 = pcVar17;
  }
  lVar12 = 8;
  if (pcVar18 < (char *)0x2) {
    lVar12 = (long)pcVar18 * 8;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_200,*(double *)((long)pdVar16 + lVar12 + 8));
  bVar11 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_200,(double *)local_180);
  local_1b0._1_1_ = bVar11;
  local_1b0._0_1_ = true;
  local_1b8 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d1f0;
  local_1a8 = (double *)local_180;
  local_1a0[0]._0_8_ = (WithinRelMatcher *)local_200;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_298,(ITransientExpression *)local_1b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_298);
  if (local_268[0xb] == false) {
    (*local_258->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1db560;
  local_1f8 = (pointer)0x3c4;
  macroName_58.m_size = 10;
  macroName_58.m_start = "CHECK_THAT";
  capturedExpression_58.m_size = 0x31;
  capturedExpression_58.m_start = "8., WithinRel( subsection1.coefficients()[2][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_298,macroName_58,(SourceLineInfo *)local_200,
             capturedExpression_58,ContinueOnFailure);
  pdVar10 = (double *)CONCAT44(local_218._12_4_,local_218._8_4_);
  pcVar17 = local_238 + 2;
  pdVar16 = (double *)(local_218._0_8_ + (long)pcVar17 * 2 * 8);
  if ((ulong)((long)pdVar10 - local_218._0_8_ >> 3) <= (long)local_238 * 2 + 4U) {
    pdVar16 = pdVar10;
  }
  local_180._0_8_ = (_func_int **)0x4020000000000000;
  pcVar18 = (char *)((long)pdVar10 - (long)pdVar16 >> 3);
  if (pcVar17 < pcVar18) {
    pcVar18 = pcVar17;
  }
  lVar12 = 8;
  if (pcVar18 < (char *)0x2) {
    lVar12 = (long)pcVar18 * 8;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_200,*(double *)((long)pdVar16 + lVar12));
  bVar11 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_200,(double *)local_180);
  local_1b0._1_1_ = bVar11;
  local_1b0._0_1_ = true;
  local_1b8 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d1f0;
  local_1a8 = (double *)local_180;
  local_1a0[0]._0_8_ = (WithinRelMatcher *)local_200;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_298,(ITransientExpression *)local_1b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_298);
  if (local_268[0xb] == false) {
    (*local_258->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1db560;
  local_1f8 = (pointer)0x3c5;
  macroName_59.m_size = 10;
  macroName_59.m_start = "CHECK_THAT";
  capturedExpression_59.m_size = 0x31;
  capturedExpression_59.m_start = "9., WithinRel( subsection1.coefficients()[2][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_298,macroName_59,(SourceLineInfo *)local_200,
             capturedExpression_59,ContinueOnFailure);
  pdVar10 = (double *)CONCAT44(local_218._12_4_,local_218._8_4_);
  pcVar17 = local_238 + 2;
  pdVar16 = (double *)(local_218._0_8_ + (long)pcVar17 * 2 * 8);
  if ((ulong)((long)pdVar10 - local_218._0_8_ >> 3) <= (long)local_238 * 2 + 4U) {
    pdVar16 = pdVar10;
  }
  local_180._0_8_ = (_func_int **)0x4022000000000000;
  pcVar18 = (char *)((long)pdVar10 - (long)pdVar16 >> 3);
  if (pcVar17 < pcVar18) {
    pcVar18 = pcVar17;
  }
  lVar12 = 8;
  if (pcVar18 < (char *)0x2) {
    lVar12 = (long)pcVar18 * 8;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_200,*(double *)((long)pdVar16 + lVar12 + 8));
  bVar11 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_200,(double *)local_180);
  local_1b0._1_1_ = bVar11;
  local_1b0._0_1_ = true;
  local_1b8 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d1f0;
  local_1a8 = (double *)local_180;
  local_1a0[0]._0_8_ = (WithinRelMatcher *)local_200;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_298,(ITransientExpression *)local_1b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_298);
  if (local_268[0xb] == false) {
    (*local_258->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1db560;
  local_1f8 = (pointer)0x3c6;
  macroName_60.m_size = 10;
  macroName_60.m_start = "CHECK_THAT";
  capturedExpression_60.m_size = 0x32;
  capturedExpression_60.m_start = "11., WithinRel( subsection1.coefficients()[3][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_298,macroName_60,(SourceLineInfo *)local_200,
             capturedExpression_60,ContinueOnFailure);
  pcVar17 = local_238 + 2;
  pdVar10 = (double *)CONCAT44(local_218._12_4_,local_218._8_4_);
  pdVar16 = (double *)(local_218._0_8_ + (long)pcVar17 * 3 * 8);
  if ((ulong)((long)pdVar10 - local_218._0_8_ >> 3) <= (ulong)((long)pcVar17 * 3)) {
    pdVar16 = pdVar10;
  }
  local_180._0_8_ = (_func_int **)0x4026000000000000;
  pcVar18 = (char *)((long)pdVar10 - (long)pdVar16 >> 3);
  if (pcVar17 < pcVar18) {
    pcVar18 = pcVar17;
  }
  lVar12 = 8;
  if (pcVar18 < (char *)0x2) {
    lVar12 = (long)pcVar18 * 8;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_200,*(double *)((long)pdVar16 + lVar12));
  bVar11 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_200,(double *)local_180);
  local_1b0._1_1_ = bVar11;
  local_1b0._0_1_ = true;
  local_1b8 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d1f0;
  local_1a8 = (double *)local_180;
  local_1a0[0]._0_8_ = (WithinRelMatcher *)local_200;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_298,(ITransientExpression *)local_1b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_298);
  if (local_268[0xb] == false) {
    (*local_258->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1db560;
  local_1f8 = (pointer)0x3c7;
  macroName_61.m_size = 10;
  macroName_61.m_start = "CHECK_THAT";
  capturedExpression_61.m_size = 0x32;
  capturedExpression_61.m_start = "12., WithinRel( subsection1.coefficients()[3][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_298,macroName_61,(SourceLineInfo *)local_200,
             capturedExpression_61,ContinueOnFailure);
  pcVar17 = local_238 + 2;
  pdVar10 = (double *)CONCAT44(local_218._12_4_,local_218._8_4_);
  pdVar16 = (double *)(local_218._0_8_ + (long)pcVar17 * 3 * 8);
  if ((ulong)((long)pdVar10 - local_218._0_8_ >> 3) <= (ulong)((long)pcVar17 * 3)) {
    pdVar16 = pdVar10;
  }
  local_180._0_8_ = (_func_int **)0x4028000000000000;
  pcVar18 = (char *)((long)pdVar10 - (long)pdVar16 >> 3);
  if (pcVar17 < pcVar18) {
    pcVar18 = pcVar17;
  }
  lVar12 = 8;
  if (pcVar18 < (char *)0x2) {
    lVar12 = (long)pcVar18 * 8;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_200,*(double *)((long)pdVar16 + lVar12 + 8));
  bVar11 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_200,(double *)local_180);
  local_1b0._1_1_ = bVar11;
  local_1b0._0_1_ = true;
  local_1b8 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d1f0;
  local_1a8 = (double *)local_180;
  local_1a0[0]._0_8_ = (WithinRelMatcher *)local_200;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_298,(ITransientExpression *)local_1b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_298);
  if (local_268[0xb] == false) {
    (*local_258->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1db560;
  local_1f8 = (pointer)0x3c8;
  macroName_62.m_size = 5;
  macroName_62.m_start = "CHECK";
  capturedExpression_62.m_size = 0x34;
  capturedExpression_62.m_start = "4 == subsection1.totalEmissionProbabilities().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_298,macroName_62,(SourceLineInfo *)local_200,
             capturedExpression_62,ContinueOnFailure);
  local_1e8[0]._8_8_ =
       (ulong)(local_238 +
              ((CONCAT44(local_218._12_4_,local_218._8_4_) - local_218._0_8_) + -8 >> 3) + 1) /
       (ulong)(local_238 + 2);
  local_1f8._1_1_ = local_1e8[0]._8_8_ == 4;
  local_1f8._0_1_ = true;
  local_200 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d270;
  local_1f8._4_4_ = 4;
  local_1f0 = "==";
  local_1e8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_298,(ITransientExpression *)local_200);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_298);
  if (local_268[0xb] == false) {
    (*local_258->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1db560;
  local_1f8 = (pointer)0x3c9;
  macroName_63.m_size = 10;
  macroName_63.m_start = "CHECK_THAT";
  capturedExpression_63.m_size = 0x3c;
  capturedExpression_63.m_start = "2., WithinRel( subsection1.totalEmissionProbabilities()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_298,macroName_63,(SourceLineInfo *)local_200,
             capturedExpression_63,ContinueOnFailure);
  local_180._0_8_ = (_func_int **)0x4000000000000000;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_200,*(double *)(local_218._0_8_ + 8));
  bVar11 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_200,(double *)local_180);
  local_1b0._1_1_ = bVar11;
  local_1b0._0_1_ = true;
  local_1b8 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d1f0;
  local_1a8 = (double *)local_180;
  local_1a0[0]._0_8_ = (WithinRelMatcher *)local_200;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_298,(ITransientExpression *)local_1b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_298);
  if (local_268[0xb] == false) {
    (*local_258->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1db560;
  local_1f8 = (pointer)0x3ca;
  macroName_64.m_size = 10;
  macroName_64.m_start = "CHECK_THAT";
  capturedExpression_64.m_size = 0x3c;
  capturedExpression_64.m_start = "5., WithinRel( subsection1.totalEmissionProbabilities()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_298,macroName_64,(SourceLineInfo *)local_200,
             capturedExpression_64,ContinueOnFailure);
  local_d8._0_8_ = (_func_int **)0x4014000000000000;
  local_1a8 = (double *)(local_218._0_8_ + 8);
  local_1a0[0]._0_8_ = local_238 + 2;
  lVar12 = CONCAT44(local_218._12_4_,local_218._8_4_) - (long)local_1a8;
  auVar5._8_8_ = lVar12 >> 0x3f;
  auVar5._0_8_ = lVar12 >> 3;
  lVar12 = SUB168(auVar5 % SEXT816((long)local_1a0[0]._0_8_),0);
  local_1a0[0]._8_8_ = local_1a0[0]._0_8_ - lVar12;
  if (lVar12 == 0) {
    local_1a0[0]._8_8_ = 0;
  }
  local_70._M_current = local_1a8;
  local_68 = local_1b8;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_68,&local_70,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_200,*local_70._M_current);
  bVar11 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_200,(double *)local_d8);
  bStack_177 = bVar11;
  local_180[8] = true;
  local_180._0_8_ = &PTR_streamReconstructedExpression_0022d1f0;
  local_170 = (iterator_t<CRng> *)local_d8;
  local_168 = (WithinRelMatcher *)local_200;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_298,(ITransientExpression *)local_180);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_180);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_298);
  if (local_268[0xb] == false) {
    (*local_258->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1db560;
  local_1f8 = (pointer)0x3cb;
  macroName_65.m_size = 10;
  macroName_65.m_start = "CHECK_THAT";
  capturedExpression_65.m_size = 0x3c;
  capturedExpression_65.m_start = "8., WithinRel( subsection1.totalEmissionProbabilities()[2] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_298,macroName_65,(SourceLineInfo *)local_200,
             capturedExpression_65,ContinueOnFailure);
  local_d8._0_8_ = (_func_int **)0x4020000000000000;
  local_1a8 = (double *)(local_218._0_8_ + 8);
  local_1a0[0]._0_8_ = local_238 + 2;
  lVar12 = CONCAT44(local_218._12_4_,local_218._8_4_) - (long)local_1a8;
  auVar6._8_8_ = lVar12 >> 0x3f;
  auVar6._0_8_ = lVar12 >> 3;
  lVar12 = SUB168(auVar6 % SEXT816((long)local_1a0[0]._0_8_),0);
  local_1a0[0]._8_8_ = local_1a0[0]._0_8_ - lVar12;
  if (lVar12 == 0) {
    local_1a0[0]._8_8_ = 0;
  }
  local_60._M_current = local_1a8;
  local_58 = local_1b8;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_58,&local_60,2);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_200,*local_60._M_current);
  bVar11 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_200,(double *)local_d8);
  bStack_177 = bVar11;
  local_180[8] = true;
  local_180._0_8_ = &PTR_streamReconstructedExpression_0022d1f0;
  local_170 = (iterator_t<CRng> *)local_d8;
  local_168 = (WithinRelMatcher *)local_200;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_298,(ITransientExpression *)local_180);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_180);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_298);
  if (local_268[0xb] == false) {
    (*local_258->_vptr_IResultCapture[0x13])();
  }
  local_200 = (undefined1  [8])0x1db560;
  local_1f8 = (pointer)0x3cc;
  macroName_66.m_size = 10;
  macroName_66.m_start = "CHECK_THAT";
  capturedExpression_66.m_size = 0x3d;
  capturedExpression_66.m_start = "11., WithinRel( subsection1.totalEmissionProbabilities()[3] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_298,macroName_66,(SourceLineInfo *)local_200,
             capturedExpression_66,ContinueOnFailure);
  local_d8._0_8_ = (_func_int **)0x4026000000000000;
  local_1a8 = (double *)(local_218._0_8_ + 8);
  local_1a0[0]._0_8_ = local_238 + 2;
  lVar12 = CONCAT44(local_218._12_4_,local_218._8_4_) - (long)local_1a8;
  auVar7._8_8_ = lVar12 >> 0x3f;
  auVar7._0_8_ = lVar12 >> 3;
  lVar12 = SUB168(auVar7 % SEXT816((long)local_1a0[0]._0_8_),0);
  local_1a0[0]._8_8_ = local_1a0[0]._0_8_ - lVar12;
  if (lVar12 == 0) {
    local_1a0[0]._8_8_ = 0;
  }
  local_50._M_current = local_1a8;
  local_48 = local_1b8;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_48,&local_50,3);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_200,*local_50._M_current);
  bVar11 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_200,(double *)local_d8);
  bStack_177 = bVar11;
  local_180[8] = true;
  local_180._0_8_ = &PTR_streamReconstructedExpression_0022d1f0;
  local_170 = (iterator_t<CRng> *)local_d8;
  local_168 = (WithinRelMatcher *)local_200;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_298,(ITransientExpression *)local_180);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_180);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_200);
  Catch::AssertionHandler::complete((AssertionHandler *)local_298);
  if (local_268[0xb] == false) {
    (*local_258->_vptr_IResultCapture[0x13])();
  }
  pvVar14 = std::
            get<0ul,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>
                      (local_f8.
                       super__Vector_base<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
  local_298 = *(undefined1 (*) [8])
               &(pvVar14->super_Base).super_ListRecord.metadata.fields.
                super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                super__Tuple_impl<2UL,_long,_long,_long,_long>;
  uStack_290 = (pvVar14->super_Base).super_ListRecord.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
               super__Head_base<4UL,_long,_false>._M_head_impl;
  local_288 = (double *)
              (pvVar14->super_Base).super_ListRecord.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
              _M_head_impl;
  pWStack_280 = (WithinRelMatcher *)
                (pvVar14->super_Base).super_ListRecord.metadata.fields.
                super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
                _M_head_impl;
  local_278 = (char *)(pvVar14->super_Base).super_ListRecord.metadata.fields.
                      super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                      super__Head_base<1UL,_double,_false>._M_head_impl;
  dStack_270 = (pvVar14->super_Base).super_ListRecord.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Head_base<0UL,_double,_false>._M_head_impl;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_268,
             &(pvVar14->super_Base).super_ListRecord.data);
  local_1b8 = (undefined1  [8])0x1db560;
  local_1b0 = (pointer)0x3cf;
  macroName_67.m_size = 10;
  macroName_67.m_start = "CHECK_THAT";
  capturedExpression_67.m_size = 0x2f;
  capturedExpression_67.m_start = "2e+7, WithinRel( subsection2.incidentEnergy() )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_67,(SourceLineInfo *)local_1b8,
             capturedExpression_67,ContinueOnFailure);
  local_d8._0_8_ = (_func_int **)0x417312d000000000;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_1b8,(double)local_278);
  bVar11 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_1b8,(double *)local_d8);
  bStack_177 = bVar11;
  local_180[8] = true;
  local_180._0_8_ = &PTR_streamReconstructedExpression_0022d1f0;
  local_170 = (iterator_t<CRng> *)local_d8;
  local_168 = (WithinRelMatcher *)local_1b8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_180);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_180);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1b8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b8 = (undefined1  [8])0x1db560;
  local_1b0 = (pointer)0x3d0;
  macroName_68.m_size = 5;
  macroName_68.m_start = "CHECK";
  capturedExpression_68.m_size = 0x17;
  capturedExpression_68.m_start = "1 == subsection2.LANG()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_68,(SourceLineInfo *)local_1b8,
             capturedExpression_68,ContinueOnFailure);
  local_1b0._0_2_ = 0x101;
  local_1b8 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d1b0;
  local_1b0._4_4_ = 1;
  local_1a8 = (double *)0x1e05de;
  local_1a0[0]._M_allocated_capacity = 2;
  local_1a0[0]._8_4_ = 1;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_1b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b8 = (undefined1  [8])0x1db560;
  local_1b0 = (pointer)0x3d1;
  macroName_69.m_size = 5;
  macroName_69.m_start = "CHECK";
  capturedExpression_69.m_size = 0x15;
  capturedExpression_69.m_start = "0 == subsection2.ND()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_69,(SourceLineInfo *)local_1b8,
             capturedExpression_69,ContinueOnFailure);
  local_1b0._1_1_ = pWStack_280 == (WithinRelMatcher *)0x0;
  local_1b0._0_1_ = true;
  local_1b8 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d230;
  local_1b0 = local_1b0 & 0xffffffff;
  local_1a8 = (double *)0x1e05de;
  local_1a0[0]._M_allocated_capacity = 2;
  local_1a0[0]._8_8_ = pWStack_280;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_1b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b8 = (undefined1  [8])0x1db560;
  local_1b0 = (pointer)0x3d2;
  macroName_70.m_size = 5;
  macroName_70.m_start = "CHECK";
  capturedExpression_70.m_size = 0x15;
  capturedExpression_70.m_start = "1 == subsection2.NA()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_70,(SourceLineInfo *)local_1b8,
             capturedExpression_70,ContinueOnFailure);
  local_1b0._1_1_ = local_288 == (double *)0x1;
  local_1b0._0_1_ = true;
  local_1b8 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d230;
  local_1b0._4_4_ = 1;
  local_1a8 = (double *)0x1e05de;
  local_1a0[0]._M_allocated_capacity = 2;
  local_1a0[0]._8_8_ = local_288;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_1b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b8 = (undefined1  [8])0x1db560;
  local_1b0 = (pointer)0x3d3;
  macroName_71.m_size = 5;
  macroName_71.m_start = "CHECK";
  capturedExpression_71.m_size = 0x15;
  capturedExpression_71.m_start = "6 == subsection2.NW()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_71,(SourceLineInfo *)local_1b8,
             capturedExpression_71,ContinueOnFailure);
  lVar12 = CONCAT44(local_268._12_4_,local_268._8_4_) - local_268._0_8_;
  local_1a0[0]._8_8_ = lVar12 >> 3;
  local_1b0._1_1_ = lVar12 == 0x30;
  local_1b0._0_1_ = true;
  local_1b8 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d230;
  local_1b0._4_4_ = 6;
  local_1a8 = (double *)0x1e05de;
  local_1a0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_1b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b8 = (undefined1  [8])0x1db560;
  local_1b0 = (pointer)0x3d4;
  macroName_72.m_size = 5;
  macroName_72.m_start = "CHECK";
  capturedExpression_72.m_size = 0x16;
  capturedExpression_72.m_start = "2 == subsection2.NEP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_72,(SourceLineInfo *)local_1b8,
             capturedExpression_72,ContinueOnFailure);
  local_1b0._1_1_ = local_298 == (undefined1  [8])0x2;
  local_1b0._0_1_ = true;
  local_1b8 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d230;
  local_1b0._4_4_ = 2;
  local_1a8 = (double *)0x1e05de;
  local_1a0[0]._M_allocated_capacity = 2;
  local_1a0[0]._8_8_ = local_298;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_1b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b8 = (undefined1  [8])0x1db560;
  local_1b0 = (pointer)0x3d5;
  macroName_73.m_size = 5;
  macroName_73.m_start = "CHECK";
  capturedExpression_73.m_size = 0x22;
  capturedExpression_73.m_start = "2 == subsection2.energies().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_73,(SourceLineInfo *)local_1b8,
             capturedExpression_73,ContinueOnFailure);
  local_1a0[0]._8_8_ =
       (ulong)((long)local_288 +
              (CONCAT44(local_268._12_4_,local_268._8_4_) - local_268._0_8_ >> 3) + 1) /
       (ulong)((long)local_288 + 2);
  local_1b0._1_1_ = local_1a0[0]._8_8_ == 2;
  local_1b0._0_1_ = true;
  local_1b8 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d270;
  local_1b0._4_4_ = 2;
  local_1a8 = (double *)0x1e05de;
  local_1a0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_1b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b8 = (undefined1  [8])0x1db560;
  local_1b0 = (pointer)0x3d6;
  macroName_74.m_size = 10;
  macroName_74.m_start = "CHECK_THAT";
  capturedExpression_74.m_size = 0x2a;
  capturedExpression_74.m_start = "1., WithinRel( subsection2.energies()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_74,(SourceLineInfo *)local_1b8,
             capturedExpression_74,ContinueOnFailure);
  local_d8._0_8_ = (_func_int **)0x3ff0000000000000;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_1b8,*(double *)local_268._0_8_);
  bVar11 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_1b8,(double *)local_d8);
  bStack_177 = bVar11;
  local_180[8] = true;
  local_180._0_8_ = &PTR_streamReconstructedExpression_0022d1f0;
  local_170 = (iterator_t<CRng> *)local_d8;
  local_168 = (WithinRelMatcher *)local_1b8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_180);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_180);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1b8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b8 = (undefined1  [8])0x1db560;
  local_1b0 = (pointer)0x3d7;
  macroName_75.m_size = 10;
  macroName_75.m_start = "CHECK_THAT";
  capturedExpression_75.m_size = 0x2a;
  capturedExpression_75.m_start = "4., WithinRel( subsection2.energies()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_75,(SourceLineInfo *)local_1b8,
             capturedExpression_75,ContinueOnFailure);
  local_b8._M_current = (double *)0x4010000000000000;
  local_c8 = (double *)((long)local_288 + 2);
  local_38 = local_d8;
  lVar12 = CONCAT44(local_268._12_4_,local_268._8_4_) - local_268._0_8_;
  auVar8._8_8_ = lVar12 >> 0x3f;
  auVar8._0_8_ = lVar12 >> 3;
  lVar12 = SUB168(auVar8 % SEXT816((long)local_c8),0);
  local_c0 = (WithinRelMatcher *)((long)local_c8 - lVar12);
  if (lVar12 == 0) {
    local_c0 = (WithinRelMatcher *)0x0;
  }
  local_40._M_current = (double *)local_268._0_8_;
  unique0x10006d80 = (vector<double,_std::allocator<double>_> *)local_268;
  ranges::stride_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>::
  adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_38,&local_40,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_1b8,*local_40._M_current);
  bVar11 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_1b8,(double *)&local_b8);
  bStack_177 = bVar11;
  local_180[8] = true;
  local_180._0_8_ = &PTR_streamReconstructedExpression_0022d1f0;
  local_170 = &local_b8;
  local_168 = (WithinRelMatcher *)local_1b8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_180);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_180);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1b8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b8 = (undefined1  [8])0x1db560;
  local_1b0 = (pointer)0x3d8;
  macroName_76.m_size = 5;
  macroName_76.m_start = "CHECK";
  capturedExpression_76.m_size = 0x26;
  capturedExpression_76.m_start = "2 == subsection2.coefficients().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_76,(SourceLineInfo *)local_1b8,
             capturedExpression_76,ContinueOnFailure);
  uVar15 = CONCAT44(local_268._12_4_,local_268._8_4_) - local_268._0_8_ >> 3;
  local_1a0[0]._8_8_ =
       (uVar15 / (ulong)((long)local_288 + 2) + 1) -
       (ulong)(uVar15 % (ulong)((long)local_288 + 2) == 0);
  local_1b0._1_1_ = local_1a0[0]._8_8_ == 2;
  local_1b0._0_1_ = true;
  local_1b8 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d270;
  local_1b0._4_4_ = 2;
  local_1a8 = (double *)0x1e05de;
  local_1a0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_1b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b8 = (undefined1  [8])0x1db560;
  local_1b0 = (pointer)0x3d9;
  macroName_77.m_size = 10;
  macroName_77.m_start = "CHECK_THAT";
  capturedExpression_77.m_size = 0x31;
  capturedExpression_77.m_start = "2., WithinRel( subsection2.coefficients()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_77,(SourceLineInfo *)local_1b8,
             capturedExpression_77,ContinueOnFailure);
  local_d8._0_8_ = (_func_int **)0x4000000000000000;
  pcVar17 = (char *)(CONCAT44(local_268._12_4_,local_268._8_4_) - local_268._0_8_ >> 3);
  if ((char *)((long)local_288 + 2) < pcVar17) {
    pcVar17 = (char *)((long)local_288 + 2);
  }
  lVar12 = 8;
  if (pcVar17 < (char *)0x2) {
    lVar12 = (long)pcVar17 * 8;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_1b8,*(double *)(local_268._0_8_ + lVar12));
  bVar11 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_1b8,(double *)local_d8);
  bStack_177 = bVar11;
  local_180[8] = true;
  local_180._0_8_ = &PTR_streamReconstructedExpression_0022d1f0;
  local_170 = (iterator_t<CRng> *)local_d8;
  local_168 = (WithinRelMatcher *)local_1b8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_180);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_180);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1b8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b8 = (undefined1  [8])0x1db560;
  local_1b0 = (pointer)0x3da;
  macroName_78.m_size = 10;
  macroName_78.m_start = "CHECK_THAT";
  capturedExpression_78.m_size = 0x31;
  capturedExpression_78.m_start = "3., WithinRel( subsection2.coefficients()[0][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_78,(SourceLineInfo *)local_1b8,
             capturedExpression_78,ContinueOnFailure);
  local_d8._0_8_ = (_func_int **)0x4008000000000000;
  pcVar17 = (char *)(CONCAT44(local_268._12_4_,local_268._8_4_) - local_268._0_8_ >> 3);
  if ((char *)((long)local_288 + 2) < pcVar17) {
    pcVar17 = (char *)((long)local_288 + 2);
  }
  lVar12 = 8;
  if (pcVar17 < (char *)0x2) {
    lVar12 = (long)pcVar17 * 8;
  }
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_1b8,*(double *)(local_268._0_8_ + lVar12 + 8));
  bVar11 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_1b8,(double *)local_d8);
  bStack_177 = bVar11;
  local_180[8] = true;
  local_180._0_8_ = &PTR_streamReconstructedExpression_0022d1f0;
  local_170 = (iterator_t<CRng> *)local_d8;
  local_168 = (WithinRelMatcher *)local_1b8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_180);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_180);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1b8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b8 = (undefined1  [8])0x1db560;
  local_1b0 = (pointer)0x3db;
  macroName_79.m_size = 10;
  macroName_79.m_start = "CHECK_THAT";
  capturedExpression_79.m_size = 0x31;
  capturedExpression_79.m_start = "5., WithinRel( subsection2.coefficients()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_79,(SourceLineInfo *)local_1b8,
             capturedExpression_79,ContinueOnFailure);
  pcVar17 = (char *)((long)local_288 + 2);
  pdVar10 = (double *)CONCAT44(local_268._12_4_,local_268._8_4_);
  pdVar16 = (double *)(local_268._0_8_ + (char *)((long)local_288 + 2) * 8);
  if ((long)pdVar10 - local_268._0_8_ >> 3 <= (long)pcVar17) {
    pdVar16 = pdVar10;
  }
  local_d8._0_8_ = (_func_int **)0x4014000000000000;
  pcVar18 = (char *)((long)pdVar10 - (long)pdVar16 >> 3);
  if (pcVar17 < pcVar18) {
    pcVar18 = pcVar17;
  }
  lVar12 = 8;
  if (pcVar18 < (char *)0x2) {
    lVar12 = (long)pcVar18 * 8;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_1b8,*(double *)((long)pdVar16 + lVar12));
  bVar11 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_1b8,(double *)local_d8);
  bStack_177 = bVar11;
  local_180[8] = true;
  local_180._0_8_ = &PTR_streamReconstructedExpression_0022d1f0;
  local_170 = (iterator_t<CRng> *)local_d8;
  local_168 = (WithinRelMatcher *)local_1b8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_180);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_180);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1b8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b8 = (undefined1  [8])0x1db560;
  local_1b0 = (pointer)0x3dc;
  macroName_80.m_size = 10;
  macroName_80.m_start = "CHECK_THAT";
  capturedExpression_80.m_size = 0x31;
  capturedExpression_80.m_start = "6., WithinRel( subsection2.coefficients()[1][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_80,(SourceLineInfo *)local_1b8,
             capturedExpression_80,ContinueOnFailure);
  pcVar17 = (char *)((long)local_288 + 2);
  pdVar10 = (double *)CONCAT44(local_268._12_4_,local_268._8_4_);
  pdVar16 = (double *)(local_268._0_8_ + (char *)((long)local_288 + 2) * 8);
  if ((long)pdVar10 - local_268._0_8_ >> 3 <= (long)pcVar17) {
    pdVar16 = pdVar10;
  }
  local_d8._0_8_ = (_func_int **)0x4018000000000000;
  pcVar18 = (char *)((long)pdVar10 - (long)pdVar16 >> 3);
  if (pcVar17 < pcVar18) {
    pcVar18 = pcVar17;
  }
  lVar12 = 8;
  if (pcVar18 < (char *)0x2) {
    lVar12 = (long)pcVar18 * 8;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_1b8,*(double *)((long)pdVar16 + lVar12 + 8));
  bVar11 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_1b8,(double *)local_d8);
  bStack_177 = bVar11;
  local_180[8] = true;
  local_180._0_8_ = &PTR_streamReconstructedExpression_0022d1f0;
  local_170 = (iterator_t<CRng> *)local_d8;
  local_168 = (WithinRelMatcher *)local_1b8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_180);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_180);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1b8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b8 = (undefined1  [8])0x1db560;
  local_1b0 = (pointer)0x3dd;
  macroName_81.m_size = 5;
  macroName_81.m_start = "CHECK";
  capturedExpression_81.m_size = 0x34;
  capturedExpression_81.m_start = "2 == subsection2.totalEmissionProbabilities().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_81,(SourceLineInfo *)local_1b8,
             capturedExpression_81,ContinueOnFailure);
  local_1a0[0]._8_8_ =
       (ulong)((long)local_288 +
              ((CONCAT44(local_268._12_4_,local_268._8_4_) - local_268._0_8_) + -8 >> 3) + 1) /
       (ulong)((long)local_288 + 2);
  local_1b0._1_1_ = local_1a0[0]._8_8_ == 2;
  local_1b0._0_1_ = true;
  local_1b8 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d270;
  local_1b0._4_4_ = 2;
  local_1a8 = (double *)0x1e05de;
  local_1a0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_1b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b8 = (undefined1  [8])0x1db560;
  local_1b0 = (pointer)0x3de;
  macroName_82.m_size = 10;
  macroName_82.m_start = "CHECK_THAT";
  capturedExpression_82.m_size = 0x3c;
  capturedExpression_82.m_start = "2., WithinRel( subsection2.totalEmissionProbabilities()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_82,(SourceLineInfo *)local_1b8,
             capturedExpression_82,ContinueOnFailure);
  local_d8._0_8_ = (_func_int **)0x4000000000000000;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_1b8,*(double *)(local_268._0_8_ + 8));
  bVar11 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_1b8,(double *)local_d8);
  bStack_177 = bVar11;
  local_180[8] = true;
  local_180._0_8_ = &PTR_streamReconstructedExpression_0022d1f0;
  local_170 = (iterator_t<CRng> *)local_d8;
  local_168 = (WithinRelMatcher *)local_1b8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_180);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_180);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1b8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b8 = (undefined1  [8])0x1db560;
  local_1b0 = (pointer)0x3df;
  macroName_83.m_size = 10;
  macroName_83.m_start = "CHECK_THAT";
  capturedExpression_83.m_size = 0x3c;
  capturedExpression_83.m_start = "5., WithinRel( subsection2.totalEmissionProbabilities()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_83,(SourceLineInfo *)local_1b8,
             capturedExpression_83,ContinueOnFailure);
  local_a8 = 5.0;
  local_170 = (iterator_t<CRng> *)(local_268._0_8_ + 8);
  local_168 = (WithinRelMatcher *)((long)local_288 + 2);
  lVar12 = CONCAT44(local_268._12_4_,local_268._8_4_) - (long)local_170;
  auVar9._8_8_ = lVar12 >> 0x3f;
  auVar9._0_8_ = lVar12 >> 3;
  lVar12 = SUB168(auVar9 % SEXT816((long)local_168),0);
  local_160 = (long)local_168 - lVar12;
  if (lVar12 == 0) {
    local_160 = 0;
  }
  local_b8._M_current = (double *)local_170;
  local_b0 = local_180;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_b0,&local_b8,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_1b8,*local_b8._M_current);
  bVar11 = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_1b8,&local_a8);
  bStack_cf = bVar11;
  local_d8[8] = true;
  local_d8._0_8_ = &PTR_streamReconstructedExpression_0022d1f0;
  local_c8 = &local_a8;
  local_c0 = (WithinRelMatcher *)local_1b8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1b8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  local_1b8 = (undefined1  [8])0x1db560;
  local_1b0 = (pointer)0x3e1;
  macroName_84.m_size = 5;
  macroName_84.m_start = "CHECK";
  capturedExpression_84.m_size = 0x10;
  capturedExpression_84.m_start = "11 == chunk.NC()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_200,macroName_84,(SourceLineInfo *)local_1b8,
             capturedExpression_84,ContinueOnFailure);
  local_1a0[0]._8_8_ = njoy::ENDFtk::section::Type<6>::ReactionProduct::NC(chunk);
  local_1b0._1_1_ = local_1a0[0]._8_8_ == 0xb;
  local_1b0._0_1_ = true;
  local_1b8 = (undefined1  [8])&PTR_streamReconstructedExpression_0022d230;
  local_1b0._4_4_ = 0xb;
  local_1a8 = (double *)0x1e05de;
  local_1a0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_200,(ITransientExpression *)local_1b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1b8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_200);
  if (local_1c5 == false) {
    (*local_1c0->_vptr_IResultCapture[0x13])();
  }
  if ((double *)local_268._0_8_ != (double *)0x0) {
    operator_delete((void *)local_268._0_8_,(long)local_258 - local_268._0_8_);
  }
  if ((double *)local_218._0_8_ != (double *)0x0) {
    operator_delete((void *)local_218._0_8_,(long)local_208 - local_218._0_8_);
  }
  std::
  vector<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>_>
  ::~vector(&local_f8);
  if (local_110.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (long *)0x0) {
    operator_delete(local_110.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_110.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((long *)local_128._0_8_ != (long *)0x0) {
    operator_delete((void *)local_128._0_8_,(long)local_118 - local_128._0_8_);
  }
  return;
}

Assistant:

void verifyChunkWithLAW1( const ReactionProduct& chunk ) {

  CHECK( 1001 == chunk.ZAP() );
  CHECK_THAT( 0.9986234, WithinRel( chunk.AWP() ) );
  CHECK( 0 == chunk.LIP() );
  CHECK( 1 == chunk.LAW() );

  CHECK( 1001 == chunk.multiplicity().ZAP() );
  CHECK_THAT( 0.9986234, WithinRel( chunk.multiplicity().AWP() ) );
  CHECK( 0 == chunk.multiplicity().LIP() );
  CHECK( 1 == chunk.multiplicity().LAW() );

  CHECK( 4 == chunk.multiplicity().NP() );
  CHECK( 4 == chunk.multiplicity().numberPoints() );
  CHECK( 1 == chunk.multiplicity().NR() );
  CHECK( 1 == chunk.multiplicity().numberInterpolationRegions() );
  CHECK( 1 == chunk.multiplicity().INT().size() );
  CHECK( 1 == chunk.multiplicity().NBT().size() );
  CHECK( 2 == chunk.multiplicity().INT()[0] );
  CHECK( 4 == chunk.multiplicity().NBT()[0] );
  CHECK( 1 == chunk.multiplicity().interpolants().size() );
  CHECK( 1 == chunk.multiplicity().boundaries().size() );
  CHECK( 2 == chunk.multiplicity().interpolants()[0] );
  CHECK( 4 == chunk.multiplicity().boundaries()[0] );
  CHECK( 4 == chunk.multiplicity().energies().size() );
  CHECK( 4 == chunk.multiplicity().multiplicities().size() );
  CHECK_THAT( 1e-5, WithinRel( chunk.multiplicity().energies()[0] ) );
  CHECK_THAT( 1.1e+7, WithinRel( chunk.multiplicity().energies()[1] ) );
  CHECK_THAT( 1.147e+7, WithinRel( chunk.multiplicity().energies()[2] ) );
  CHECK_THAT( 2e+7, WithinRel( chunk.multiplicity().energies()[3] ) );
  CHECK_THAT( 0., WithinRel( chunk.multiplicity().multiplicities()[0] ) );
  CHECK_THAT( 8.45368e-11, WithinRel( chunk.multiplicity().multiplicities()[1] ) );
  CHECK_THAT( 6.622950e-8, WithinRel( chunk.multiplicity().multiplicities()[2] ) );
  CHECK_THAT( 2.149790e-1, WithinRel( chunk.multiplicity().multiplicities()[3] ) );

  auto law = std::get< ContinuumEnergyAngle >( chunk.distribution() );

  CHECK( 1 == law.LAW() );
  CHECK( 2 == law.LEP() );
  CHECK( 2 == law.NE() );
  CHECK( 2 == law.numberIncidentEnergies() );
  CHECK( 1 == law.NR() );
  CHECK( 1 == law.numberInterpolationRegions() );
  CHECK( 1 == law.INT().size() );
  CHECK( 1 == law.NBT().size() );
  CHECK( 1 == law.INT()[0] );
  CHECK( 2 == law.NBT()[0] );
  CHECK( 1 == law.interpolants().size() );
  CHECK( 1 == law.boundaries().size() );
  CHECK( 1 == law.interpolants()[0] );
  CHECK( 2 == law.boundaries()[0] );

  auto energies = law.distributions();

  auto subsection1 =
      std::get< LegendreCoefficients >( energies[0] );
  CHECK_THAT( 1e-5, WithinRel( subsection1.incidentEnergy() ) );
  CHECK( 0 == subsection1.ND() );
  CHECK( 1 == subsection1.NA() );
  CHECK( 12 == subsection1.NW() );
  CHECK( 4 == subsection1.NEP() );
  CHECK( 4 == subsection1.energies().size() );
  CHECK_THAT( 1., WithinRel( subsection1.energies()[0] ) );
  CHECK_THAT( 4., WithinRel( subsection1.energies()[1] ) );
  CHECK_THAT( 7., WithinRel( subsection1.energies()[2] ) );
  CHECK_THAT( 10., WithinRel( subsection1.energies()[3] ) );
  CHECK( 4 == subsection1.coefficients().size() );
  CHECK_THAT( 2., WithinRel( subsection1.coefficients()[0][0] ) );
  CHECK_THAT( 3., WithinRel( subsection1.coefficients()[0][1] ) );
  CHECK_THAT( 5., WithinRel( subsection1.coefficients()[1][0] ) );
  CHECK_THAT( 6., WithinRel( subsection1.coefficients()[1][1] ) );
  CHECK_THAT( 8., WithinRel( subsection1.coefficients()[2][0] ) );
  CHECK_THAT( 9., WithinRel( subsection1.coefficients()[2][1] ) );
  CHECK_THAT( 11., WithinRel( subsection1.coefficients()[3][0] ) );
  CHECK_THAT( 12., WithinRel( subsection1.coefficients()[3][1] ) );
  CHECK( 4 == subsection1.totalEmissionProbabilities().size() );
  CHECK_THAT( 2., WithinRel( subsection1.totalEmissionProbabilities()[0] ) );
  CHECK_THAT( 5., WithinRel( subsection1.totalEmissionProbabilities()[1] ) );
  CHECK_THAT( 8., WithinRel( subsection1.totalEmissionProbabilities()[2] ) );
  CHECK_THAT( 11., WithinRel( subsection1.totalEmissionProbabilities()[3] ) );

  auto subsection2 = std::get< LegendreCoefficients >( energies[1] );
  CHECK_THAT( 2e+7, WithinRel( subsection2.incidentEnergy() ) );
  CHECK( 1 == subsection2.LANG() );
  CHECK( 0 == subsection2.ND() );
  CHECK( 1 == subsection2.NA() );
  CHECK( 6 == subsection2.NW() );
  CHECK( 2 == subsection2.NEP() );
  CHECK( 2 == subsection2.energies().size() );
  CHECK_THAT( 1., WithinRel( subsection2.energies()[0] ) );
  CHECK_THAT( 4., WithinRel( subsection2.energies()[1] ) );
  CHECK( 2 == subsection2.coefficients().size() );
  CHECK_THAT( 2., WithinRel( subsection2.coefficients()[0][0] ) );
  CHECK_THAT( 3., WithinRel( subsection2.coefficients()[0][1] ) );
  CHECK_THAT( 5., WithinRel( subsection2.coefficients()[1][0] ) );
  CHECK_THAT( 6., WithinRel( subsection2.coefficients()[1][1] ) );
  CHECK( 2 == subsection2.totalEmissionProbabilities().size() );
  CHECK_THAT( 2., WithinRel( subsection2.totalEmissionProbabilities()[0] ) );
  CHECK_THAT( 5., WithinRel( subsection2.totalEmissionProbabilities()[1] ) );

  CHECK( 11 == chunk.NC() );
}